

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void * bb_version_generator(gen_ctx_t gen_ctx,bb_version_t_conflict bb_version)

{
  VARR_uint8_t *pVVar1;
  VARR_spot_attr_t *pVVar2;
  spot_attr_t *psVar3;
  _IO_FILE *p_Var4;
  const_ref_t *pcVar5;
  VARR_MIR_code_reloc_t *pVVar6;
  target_bb_version_t ptVar7;
  VARR_size_t *__ptr;
  MIR_func_t pMVar8;
  byte bVar9;
  anon_union_8_2_369d9a33_for_u aVar10;
  bb_version_t_conflict pbVar11;
  uint uVar12;
  int iVar13;
  MIR_item_t pMVar14;
  FILE *pFVar15;
  void_ptr_t *__ptr_00;
  gen_ctx *pgVar16;
  FILE *__s;
  VARR_void_ptr_t *pVVar17;
  gen_ctx *pgVar18;
  target_ctx *ptVar19;
  target_ctx *extraout_RAX;
  gen_ctx *pgVar20;
  VARR_label_ref_t *pVVar21;
  MIR_code_reloc_t *__ptr_01;
  target_ctx *extraout_RAX_00;
  gen_ctx *pgVar22;
  void *extraout_RAX_01;
  void *pvVar23;
  VARR_call_ref_t *pVVar24;
  void *extraout_RAX_02;
  void *extraout_RAX_03;
  uint uVar25;
  gen_ctx *pgVar26;
  MIR_context_t pMVar27;
  MIR_context_t pMVar28;
  VARR_const_ref_t *pVVar29;
  VARR_uint64_t *pVVar30;
  c2mir_ctx **ppcVar31;
  MIR_item_t_conflict pMVar32;
  bitmap_t pVVar33;
  void **ppvVar34;
  uint8_t *puVar35;
  ulong uVar36;
  VARR_target_bb_version_t *pVVar37;
  char *pcVar38;
  gen_ctx *pgVar39;
  long lVar40;
  gen_ctx *pgVar41;
  c2mir_ctx *pcVar42;
  size_t sVar43;
  gen_ctx *pgVar44;
  MIR_item_t_conflict addr;
  gen_ctx *pgVar45;
  ulong uVar46;
  char *pcVar47;
  MIR_item_t_conflict pMVar48;
  MIR_item_t_conflict pMVar49;
  ulong uVar50;
  gen_ctx *unaff_R13;
  size_t sVar51;
  uint8_t **ppuVar52;
  char *unaff_R15;
  _IO_FILE *p_Var53;
  size_t __size;
  uint64_t uVar54;
  int iStack_164;
  gen_ctx *pgStack_160;
  MIR_item_t_conflict pMStack_158;
  gen_ctx *pgStack_150;
  gen_ctx *pgStack_148;
  gen_ctx *pgStack_140;
  MIR_context_t pMStack_138;
  gen_ctx *pgStack_130;
  gen_ctx *pgStack_128;
  gen_ctx *pgStack_120;
  gen_ctx *pgStack_118;
  gen_ctx *pgStack_110;
  gen_ctx_t pgStack_108;
  gen_ctx *pgStack_100;
  VARR_size_t *pVStack_f8;
  VARR_MIR_proto_t *pVStack_f0;
  VARR_char *local_e8;
  bitmap_t pVStack_e0;
  bitmap_t pVStack_d8;
  HTAB_MIR_item_t *pHStack_d0;
  gen_ctx *local_c0;
  gen_ctx *local_b8;
  gen_ctx *local_b0;
  gen_ctx *local_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  gen_ctx *local_88;
  gen_ctx *local_80;
  gen_ctx *local_78;
  bb_version_t_conflict local_70;
  label_ref_t local_68;
  bitmap_t local_40;
  gen_ctx *local_38;
  
  pgVar20 = (gen_ctx *)gen_ctx->temp_bitmap;
  if ((pgVar20 == (gen_ctx *)0x0) || (pgVar20->curr_func_item == (MIR_item_t)0x0))
  goto LAB_00152dd6;
  local_a8 = (gen_ctx *)gen_ctx->ctx;
  local_a0._8_8_ = bb_version->bb_stub;
  pgVar20->ctx = (MIR_context_t)0x0;
  pgVar39 = (gen_ctx *)gen_ctx->debug_file;
  if ((pgVar39 != (gen_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
    pgStack_100 = (gen_ctx *)0x15179f;
    fprintf((FILE *)pgVar39,"  IN BBStub%llx nonzero properties: ",local_a0._8_8_);
  }
  local_70 = bb_version;
  if (bb_version->n_attrs == 0) {
    uVar25 = 0;
  }
  else {
    pgVar41 = (gen_ctx *)bb_version->attrs;
    unaff_R13 = (gen_ctx *)0x0;
    local_b8 = pgVar41;
    do {
      pMVar14 = pgVar20->curr_func_item;
      local_c0 = (gen_ctx *)
                 (ulong)*(uint *)(pgVar41->call_used_hard_regs + (long)unaff_R13 * 2 + -0xd);
      pgVar39 = (gen_ctx *)((ulong)&local_c0->addr_regs >> 6);
      lVar40 = (long)pgVar39 - (long)pgVar20->ctx;
      if ((gen_ctx *)pgVar20->ctx <= pgVar39 && lVar40 != 0) {
        do {
          if (pMVar14 == (MIR_item_t)0x0) {
            pgStack_100 = (gen_ctx *)0x152d71;
            bb_version_generator_cold_1();
            goto LAB_00152d71;
          }
          pgVar41 = (gen_ctx *)pgVar20->ctx;
          pgVar39 = (gen_ctx *)((long)&pgVar41->ctx + 1);
          if (*(gen_ctx **)&pgVar20->optimize_level < pgVar39) {
            pcVar42 = (c2mir_ctx *)
                      ((long)pgVar39->call_used_hard_regs + (((ulong)pgVar39 >> 1) - 0x68));
            pgStack_100 = (gen_ctx *)0x151819;
            pMVar14 = (MIR_item_t)realloc(pMVar14,(long)pcVar42 * 8);
            pgVar20->curr_func_item = pMVar14;
            *(c2mir_ctx **)&pgVar20->optimize_level = pcVar42;
            pgVar41 = (gen_ctx *)pgVar20->ctx;
            pgVar39 = (gen_ctx *)((long)&pgVar41->ctx + 1);
          }
          lVar40 = lVar40 + -1;
          pgVar20->ctx = (MIR_context_t)pgVar39;
          (&pMVar14->data)[(long)pgVar41] = (void *)0x0;
        } while (lVar40 != 0);
      }
      pgVar41 = local_b8;
      unaff_R15 = (char *)(local_b8->call_used_hard_regs + (long)unaff_R13 * 2 + -0xd);
      (&pMVar14->data)[(ulong)local_c0 >> 6 & 0x3ffffff] =
           (void *)((ulong)(&pMVar14->data)[(ulong)local_c0 >> 6 & 0x3ffffff] |
                   1L << ((ulong)local_c0 & 0x3f));
      pgStack_100 = (gen_ctx *)0x151867;
      pgVar39 = gen_ctx;
      set_spot2attr(gen_ctx,(spot_attr_t *)unaff_R15);
      pgVar44 = (gen_ctx *)gen_ctx->debug_file;
      if ((pgVar44 != (gen_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
        if (unaff_R13 != (gen_ctx *)0x0) {
          pgStack_100 = (gen_ctx *)0x151895;
          fwrite(", ",2,1,(FILE *)pgVar44);
          pgVar44 = (gen_ctx *)gen_ctx->debug_file;
        }
        pgStack_100 = (gen_ctx *)0x1518b1;
        fprintf((FILE *)pgVar44,"(spot=%u,prop=%u)",(ulong)*(uint *)&((gen_ctx *)unaff_R15)->ctx,
                (ulong)*(uint *)((long)&((gen_ctx *)unaff_R15)->ctx + 4));
        pgVar39 = pgVar44;
      }
      unaff_R13 = (gen_ctx *)((long)&unaff_R13->ctx + 1);
      uVar25 = local_70->n_attrs;
    } while (unaff_R13 < (gen_ctx *)(ulong)uVar25);
  }
  pgVar41 = local_a8;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    pgVar39 = (gen_ctx *)0xa;
    pgStack_100 = (gen_ctx *)0x1518eb;
    fputc(10,(FILE *)gen_ctx->debug_file);
    uVar25 = local_70->n_attrs;
  }
  if (uVar25 == 0) {
    local_b0 = (gen_ctx *)0x0;
  }
  else {
    local_b0 = (gen_ctx *)(ulong)local_70->attrs[uVar25 - 1].spot;
  }
  pVVar37 = gen_ctx->target_succ_bb_versions;
  if ((pVVar37 == (VARR_target_bb_version_t *)0x0) || (pVVar37->varr == (target_bb_version_t *)0x0))
  goto LAB_00152ddb;
  pVVar37->els_num = 0;
  ptVar19 = gen_ctx->target_ctx;
  pVVar1 = ptVar19->result_code;
  if ((pVVar1 == (VARR_uint8_t *)0x0) || (pVVar1->varr == (uint8_t *)0x0)) goto LAB_00152de0;
  pVVar1->els_num = 0;
  pVVar30 = ptVar19->const_pool;
  if ((pVVar30 == (VARR_uint64_t *)0x0) || (pVVar30->varr == (uint64_t *)0x0)) goto LAB_00152de5;
  pVVar30->els_num = 0;
  pVVar29 = ptVar19->const_refs;
  if ((pVVar29 == (VARR_const_ref_t *)0x0) || (pVVar29->varr == (const_ref_t *)0x0))
  goto LAB_00152dea;
  pVVar29->els_num = 0;
  pVVar21 = ptVar19->label_refs;
  if ((pVVar21 == (VARR_label_ref_t *)0x0) || (pVVar21->varr == (label_ref_t *)0x0))
  goto LAB_00152def;
  pVVar21->els_num = 0;
  pVVar30 = ptVar19->abs_address_locs;
  if ((pVVar30 == (VARR_uint64_t *)0x0) || (pVVar30->varr == (uint64_t *)0x0)) goto LAB_00152df4;
  pVVar30->els_num = 0;
  local_c0 = *(gen_ctx **)(local_a0._8_8_ + 0x18);
  pgVar44 = (gen_ctx *)&local_c0->debug_file;
  pFVar15 = local_c0->debug_file;
  if ((int)pFVar15 - 0xa5U < 0xffffffd1) {
    local_40 = (bitmap_t)(ulong)((int)local_b0 - 0x22);
    local_38 = (gen_ctx *)((ulong)((long)&local_40[4].els_num + 2U) >> 6);
    pgVar16 = unaff_R13;
LAB_00151a25:
    unaff_R13 = local_c0;
    unaff_R15 = (char *)local_c0->curr_func_item;
    uVar25 = (uint)pFVar15;
    if (0xb5 < (int)uVar25) {
      if (1 < uVar25 - 0xb7) {
        if (uVar25 == 0xb9) goto LAB_0015226b;
        if (uVar25 != 0xb6) goto LAB_00152039;
        if ((ushort)(*(byte *)&local_c0->temp_bitmap2 - 3) < 2) {
          pgVar41 = local_a8;
          if (*(char *)&local_c0->to_free == '\v') {
            uVar25 = *(uint *)((long)&local_c0->tied_regs + 4);
            pgVar16 = (gen_ctx *)(ulong)uVar25;
            if (uVar25 != 0) {
              uVar25 = uVar25 + 0x23;
              goto LAB_001522b2;
            }
          }
          else if (*(char *)&local_c0->to_free == '\x02') {
            uVar25 = local_c0->addr_insn_p + 1;
LAB_001522b2:
            pgVar16 = (gen_ctx *)(ulong)uVar25;
            if (uVar25 != 0) {
              pgVar18 = (gen_ctx *)pgVar20->ctx;
              if (((DLIST_MIR_item_t *)&local_c0->temp_bitmap3)->head == (MIR_item_t_conflict)0x0) {
                if (pgVar16 < (gen_ctx *)((long)pgVar18 << 6)) {
                  bVar9 = (byte)uVar25 & 0x3f;
                  ppvVar34 = &pgVar20->curr_func_item->data + (uVar25 >> 6);
                  *ppvVar34 = (void *)((ulong)*ppvVar34 &
                                      (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9));
                }
              }
              else {
                pgVar39 = (gen_ctx *)((ulong)&pgVar16->addr_regs >> 6);
                lVar40 = (long)pgVar39 - (long)pgVar18;
                pMVar14 = pgVar20->curr_func_item;
                local_b8 = pgVar16;
                local_78 = (gen_ctx *)unaff_R15;
                if (pgVar18 <= pgVar39 && lVar40 != 0) {
                  do {
                    if (pMVar14 == (MIR_item_t)0x0) goto LAB_00152dbd;
                    pgVar18 = (gen_ctx *)pgVar20->ctx;
                    pgVar39 = (gen_ctx *)((long)&pgVar18->ctx + 1);
                    if (*(gen_ctx **)&pgVar20->optimize_level < pgVar39) {
                      pcVar42 = (c2mir_ctx *)
                                ((long)pgVar39->call_used_hard_regs + (((ulong)pgVar39 >> 1) - 0x68)
                                );
                      pgStack_100 = (gen_ctx *)0x15231e;
                      pMVar14 = (MIR_item_t)realloc(pMVar14,(long)pcVar42 * 8);
                      pgVar20->curr_func_item = pMVar14;
                      *(c2mir_ctx **)&pgVar20->optimize_level = pcVar42;
                      pgVar18 = (gen_ctx *)pgVar20->ctx;
                      pgVar39 = (gen_ctx *)((long)&pgVar18->ctx + 1);
                      pgVar41 = local_a8;
                    }
                    lVar40 = lVar40 + -1;
                    pgVar20->ctx = (MIR_context_t)pgVar39;
                    (&pMVar14->data)[(long)pgVar18] = (void *)0x0;
                  } while (lVar40 != 0);
                }
                (&pMVar14->data)[(ulong)local_b8 >> 6 & 0x3ffffff] =
                     (void *)((ulong)(&pMVar14->data)[(ulong)local_b8 >> 6 & 0x3ffffff] |
                             1L << ((ulong)local_b8 & 0x3f));
                local_90 = (_IO_FILE *)
                           CONCAT44(*(undefined4 *)
                                     &((DLIST_MIR_item_t *)&local_c0->temp_bitmap3)->head,uVar25);
                local_88 = (gen_ctx *)0x0;
                if (0x22 < uVar25) {
                  local_88 = (gen_ctx *)&local_c0->debug_level;
                }
                pgStack_100 = (gen_ctx *)0x152393;
                pgVar39 = gen_ctx;
                set_spot2attr(gen_ctx,(spot_attr_t *)(local_a0 + 0x10));
                unaff_R15 = (char *)local_78;
              }
            }
          }
          goto LAB_0015226b;
        }
        goto LAB_00152e54;
      }
      if (1 < (ushort)(*(byte *)(local_c0->call_used_hard_regs + 4) - 3)) goto LAB_00152e08;
      if (*(char *)&local_c0->temp_bitmap2 == '\v') {
        iVar13 = *(int *)((long)local_c0->call_used_hard_regs + 4);
        uVar12 = iVar13 + 0x23;
        if (iVar13 == 0) {
          uVar12 = 0;
        }
      }
      else {
        uVar12 = 0;
        if (*(char *)&local_c0->temp_bitmap2 == '\x02') {
          uVar12 = *(int *)&((DLIST_MIR_item_t *)&local_c0->temp_bitmap3)->head + 1;
        }
      }
      uVar46 = (ulong)uVar12;
      if ((uVar46 < (ulong)((long)pgVar20->ctx << 6)) &&
         (((ulong)(&pgVar20->curr_func_item->data)[uVar12 >> 6] >> (uVar46 & 0x3f) & 1) != 0)) {
        pVVar2 = gen_ctx->spot2attr;
        if (((pVVar2 == (VARR_spot_attr_t *)0x0) ||
            (psVar3 = pVVar2->varr, psVar3 == (spot_attr_t *)0x0)) || (pVVar2->els_num <= uVar46)) {
          pgStack_100 = (gen_ctx *)0x152e2c;
          bb_version_generator_cold_6();
          goto LAB_00152e2c;
        }
        local_90 = *(_IO_FILE **)(psVar3 + uVar46);
        local_88 = (gen_ctx *)psVar3[uVar46].mem_ref;
        uVar46 = (ulong)local_90 >> 0x20;
      }
      else {
        uVar46 = 0;
      }
      pgVar39 = pgVar41;
      if (uVar25 == 0xb8) {
        if (local_c0->call_used_hard_regs[5] == (bitmap_t)uVar46) goto LAB_00151ee0;
      }
      else if ((uVar25 == 0xb7) && (local_c0->call_used_hard_regs[5] != (bitmap_t)uVar46)) {
LAB_00151ee0:
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          pgStack_100 = (gen_ctx *)0x151f06;
          fwrite("  Remove property insn ",0x17,1,(FILE *)gen_ctx->debug_file);
          pgStack_100 = (gen_ctx *)0x151f25;
          MIR_output_insn((MIR_context_t)pgVar41,gen_ctx->debug_file,(MIR_insn_t_conflict)local_c0,
                          (gen_ctx->curr_func_item->u).func,1);
        }
        pgStack_100 = (gen_ctx *)0x151f36;
        MIR_remove_insn((MIR_context_t)pgVar41,gen_ctx->curr_func_item,(MIR_insn_t_conflict)local_c0
                       );
        goto LAB_0015226b;
      }
      pVStack_f8 = *(VARR_size_t **)&local_c0->debug_level;
      pVStack_f0 = (VARR_MIR_proto_t *)local_c0->to_free;
      local_e8 = *(VARR_char **)&local_c0->addr_insn_p;
      pVStack_e0 = local_c0->tied_regs;
      pVStack_d8 = local_c0->addr_regs;
      pHStack_d0 = (HTAB_MIR_item_t *)local_c0->insn_to_consider;
      pgStack_100 = (gen_ctx *)0x151e2a;
      unaff_R15 = (char *)MIR_new_insn((MIR_context_t)pgVar41,MIR_JMP);
      pgStack_100 = (gen_ctx *)0x151e3f;
      MIR_insert_insn_before
                ((MIR_context_t)pgVar41,gen_ctx->curr_func_item,(MIR_insn_t_conflict)unaff_R13,
                 (MIR_insn_t_conflict)unaff_R15);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pgStack_100 = (gen_ctx *)0x151e65;
        fwrite("  Change ",9,1,(FILE *)gen_ctx->debug_file);
        pgStack_100 = (gen_ctx *)0x151e81;
        MIR_output_insn((MIR_context_t)pgVar41,gen_ctx->debug_file,(MIR_insn_t_conflict)local_c0,
                        (gen_ctx->curr_func_item->u).func,0);
        pgStack_100 = (gen_ctx *)0x151e9b;
        fwrite(" to ",4,1,(FILE *)gen_ctx->debug_file);
        pgStack_100 = (gen_ctx *)0x151eb8;
        MIR_output_insn((MIR_context_t)pgVar41,gen_ctx->debug_file,(MIR_insn_t_conflict)unaff_R15,
                        (gen_ctx->curr_func_item->u).func,1);
      }
      pgStack_100 = (gen_ctx *)0x151ec9;
      MIR_remove_insn((MIR_context_t)pgVar41,gen_ctx->curr_func_item,(MIR_insn_t_conflict)local_c0);
      goto LAB_0015227f;
    }
    unaff_R13 = pgVar16;
    if (uVar25 < 4) {
      if (*(char *)&local_c0->to_free == '\v') {
        iVar13 = *(int *)((long)&local_c0->tied_regs + 4);
        pgVar41 = (gen_ctx *)(ulong)(iVar13 + 0x23);
        if (iVar13 == 0) {
          pgVar41 = (gen_ctx *)0x0;
        }
      }
      else {
        pgVar41 = (gen_ctx *)0x0;
        if (*(char *)&local_c0->to_free == '\x02') {
          pgVar41 = (gen_ctx *)(ulong)(local_c0->addr_insn_p + 1);
        }
      }
      uVar25 = (uint)pgVar41;
      if (*(char *)&local_c0->temp_bitmap2 == '\v') {
        iVar13 = *(int *)((long)local_c0->call_used_hard_regs + 4);
        if (iVar13 != 0) {
          uVar12 = iVar13 + 0x23;
          goto LAB_00151b5d;
        }
      }
      else if (*(char *)&local_c0->temp_bitmap2 == '\x02') {
        uVar12 = *(int *)&((DLIST_MIR_item_t *)&local_c0->temp_bitmap3)->head + 1;
LAB_00151b5d:
        if (uVar12 != 0) {
          if (uVar25 == 0) {
            if (0x22 < (uint)local_b0) {
              pMVar14 = pgVar20->curr_func_item;
              lVar40 = (long)local_38 - (long)pgVar20->ctx;
              if ((gen_ctx *)pgVar20->ctx <= local_38 && lVar40 != 0) {
                do {
                  if (pMVar14 == (MIR_item_t)0x0) goto LAB_00152db8;
                  pgVar41 = (gen_ctx *)pgVar20->ctx;
                  pgVar39 = (gen_ctx *)((long)&pgVar41->ctx + 1);
                  if (*(gen_ctx **)&pgVar20->optimize_level < pgVar39) {
                    pcVar42 = (c2mir_ctx *)
                              ((long)pgVar39->call_used_hard_regs + (((ulong)pgVar39 >> 1) - 0x68));
                    pgStack_100 = (gen_ctx *)0x151fa8;
                    pMVar14 = (MIR_item_t)realloc(pMVar14,(long)pcVar42 * 8);
                    pgVar20->curr_func_item = pMVar14;
                    *(c2mir_ctx **)&pgVar20->optimize_level = pcVar42;
                    pgVar41 = (gen_ctx *)pgVar20->ctx;
                    pgVar39 = (gen_ctx *)((long)&pgVar41->ctx + 1);
                    pgVar16 = (gen_ctx *)unaff_R15;
                  }
                  lVar40 = lVar40 + -1;
                  pgVar20->ctx = (MIR_context_t)pgVar39;
                  (&pMVar14->data)[(long)pgVar41] = (void *)0x0;
                } while (lVar40 != 0);
              }
              uVar46 = 0x23;
              pVVar33 = local_40;
              do {
                uVar50 = (ulong)((uint)uVar46 & 0x3f);
                lVar40 = 0x40 - (ulong)((int)pVVar33 + (uint)uVar46 & 0x3f);
                if ((bitmap_t)(0x40 - uVar50) <= pVVar33) {
                  lVar40 = 0;
                }
                pgVar39 = (gen_ctx *)~((0xffffffffffffffffU >> (lVar40 + uVar50 & 0x3f)) << uVar50);
                (&pMVar14->data)[uVar46 >> 6] =
                     (void *)((ulong)(&pMVar14->data)[uVar46 >> 6] & (ulong)pgVar39);
                lVar40 = 0x40 - (lVar40 + uVar50);
                uVar46 = uVar46 + lVar40;
                pVVar33 = (bitmap_t)((long)pVVar33 - lVar40);
              } while (pVVar33 != (bitmap_t)0x0);
            }
          }
          else {
            pgVar18 = (gen_ctx *)pgVar20->ctx;
            pMVar28 = (MIR_context_t)(ulong)uVar12;
            if (pMVar28 < (MIR_context_t)((long)pgVar18 << 6)) {
              pMVar14 = pgVar20->curr_func_item;
              pgVar45 = (gen_ctx *)(&pMVar14->data)[uVar12 >> 6];
              if (((ulong)pgVar45 >> ((ulong)pMVar28 & 0x3f) & 1) == 0) goto LAB_00152039;
              pgVar39 = (gen_ctx *)gen_ctx->spot2attr;
              if (((pgVar39 == (gen_ctx *)0x0) ||
                  (pgVar45 = (gen_ctx *)pgVar39->curr_func_item, pgVar45 == (gen_ctx *)0x0)) ||
                 (pgVar39->ctx <= pMVar28)) {
LAB_00152e78:
                pgStack_100 = (gen_ctx *)0x152e7d;
                bb_version_generator_cold_4();
                goto LAB_00152e7d;
              }
              local_90 = (_IO_FILE *)pgVar45->call_used_hard_regs[(long)pMVar28 * 2 + -0xd];
              local_88 = (gen_ctx *)0x0;
              local_80 = pgVar41;
              local_78 = (gen_ctx *)unaff_R15;
              if (0x22 < uVar25) {
                if (gen_ctx->spot_attrs == (VARR_spot_attr_t *)0x0) goto LAB_00152ea5;
                if (0x22 < (uint)local_b0) {
                  pgVar16 = (gen_ctx *)gen_ctx->spot_attrs->varr;
                  uVar12 = 0x23;
                  local_b8 = (gen_ctx *)(pgVar16->call_used_hard_regs + (long)pgVar41 * 2 + -0xc);
                  do {
                    pgStack_100 = (gen_ctx *)0x151c3f;
                    iVar13 = may_mem_alias_p((MIR_op_t *)local_b8->ctx,
                                             (MIR_op_t *)
                                             pgVar16->call_used_hard_regs[(ulong)uVar12 * 2 + -0xc])
                    ;
                    if ((iVar13 != 0) && ((ulong)uVar12 < (ulong)((long)pgVar20->ctx << 6))) {
                      bVar9 = (byte)uVar12 & 0x3f;
                      ppvVar34 = &pgVar20->curr_func_item->data + (uVar12 >> 6);
                      *ppvVar34 = (void *)((ulong)*ppvVar34 &
                                          (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9));
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 <= (uint)local_b0);
                  pgVar18 = (gen_ctx *)pgVar20->ctx;
                  pMVar14 = pgVar20->curr_func_item;
                }
                local_88 = (gen_ctx *)&local_c0->debug_level;
              }
              pgVar39 = (gen_ctx *)((ulong)&local_80->addr_regs >> 6);
              lVar40 = (long)pgVar39 - (long)pgVar18;
              if (pgVar18 <= pgVar39 && lVar40 != 0) {
                do {
                  if (pMVar14 == (MIR_item_t)0x0) goto LAB_00152db3;
                  pgVar41 = (gen_ctx *)pgVar20->ctx;
                  pgVar39 = (gen_ctx *)((long)&pgVar41->ctx + 1);
                  if (*(gen_ctx **)&pgVar20->optimize_level < pgVar39) {
                    pcVar42 = (c2mir_ctx *)
                              ((long)pgVar39->call_used_hard_regs + (((ulong)pgVar39 >> 1) - 0x68));
                    pgStack_100 = (gen_ctx *)0x151cd3;
                    pMVar14 = (MIR_item_t)realloc(pMVar14,(long)pcVar42 * 8);
                    pgVar20->curr_func_item = pMVar14;
                    *(c2mir_ctx **)&pgVar20->optimize_level = pcVar42;
                    pgVar41 = (gen_ctx *)pgVar20->ctx;
                    pgVar39 = (gen_ctx *)((long)&pgVar41->ctx + 1);
                    pgVar16 = pgVar44;
                  }
                  lVar40 = lVar40 + -1;
                  pgVar20->ctx = (MIR_context_t)pgVar39;
                  (&pMVar14->data)[(long)pgVar41] = (void *)0x0;
                } while (lVar40 != 0);
              }
              (&pMVar14->data)[(ulong)local_80 >> 6 & 0x3ffffff] =
                   (void *)((ulong)(&pMVar14->data)[(ulong)local_80 >> 6 & 0x3ffffff] |
                           1L << ((ulong)local_80 & 0x3f));
              local_90 = (_IO_FILE *)CONCAT44(local_90._4_4_,uVar25);
              pgStack_100 = (gen_ctx *)0x151d22;
              pgVar39 = gen_ctx;
              set_spot2attr(gen_ctx,(spot_attr_t *)(local_a0 + 0x10));
              unaff_R15 = (char *)local_78;
            }
          }
          goto LAB_00152039;
        }
      }
      if (pgVar41 < (gen_ctx *)((long)pgVar20->ctx << 6)) {
        bVar9 = (byte)pgVar41 & 0x3f;
        ppvVar34 = &pgVar20->curr_func_item->data + ((ulong)pgVar41 >> 6);
        *ppvVar34 = (void *)((ulong)*ppvVar34 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9)
                            );
      }
    }
    else if ((uVar25 == 0xa6) || (uVar25 == 0xaa)) goto LAB_001523ca;
LAB_00152039:
    if (*(int *)&pgVar44->ctx == 0xa5) {
      pVVar2 = gen_ctx->spot_attrs;
      if ((pVVar2 == (VARR_spot_attr_t *)0x0) || (pVVar2->varr == (spot_attr_t *)0x0))
      goto LAB_00152da9;
      pVVar2->els_num = 0;
      pgVar18 = (gen_ctx *)pgVar20->ctx;
      pgVar22 = (gen_ctx *)unaff_R15;
      if (pgVar18 != (gen_ctx *)0x0) {
        pgVar26 = (gen_ctx *)0x0;
        pgVar41 = (gen_ctx *)0x0;
        do {
          while ((pvVar23 = (&pgVar20->curr_func_item->data)[(long)pgVar26], pvVar23 == (void *)0x0
                 || (pgVar45 = (gen_ctx *)((ulong)pvVar23 >> ((ulong)pgVar41 & 0x3f)),
                    pgVar45 == (gen_ctx *)0x0))) {
            pgVar26 = (gen_ctx *)((long)&pgVar26->ctx + 1);
            pgVar41 = (gen_ctx *)((long)pgVar26 * 0x40);
            if (pgVar18 == pgVar26) goto LAB_00152186;
          }
          uVar46 = (ulong)pgVar45 & 1;
          while (uVar46 == 0) {
            pgVar41 = (gen_ctx *)((long)&pgVar41->ctx + 1);
            uVar46 = (ulong)pgVar45 & 2;
            pgVar45 = (gen_ctx *)((ulong)pgVar45 >> 1);
          }
          pVVar2 = gen_ctx->spot2attr;
          local_78 = pgVar22;
          if (((pVVar2 == (VARR_spot_attr_t *)0x0) ||
              (psVar3 = pVVar2->varr, psVar3 == (spot_attr_t *)0x0)) ||
             ((gen_ctx *)pVVar2->els_num <= pgVar41)) goto LAB_00152dc2;
          unaff_R15 = (char *)gen_ctx->spot_attrs;
          pgVar18 = (gen_ctx *)((gen_ctx *)unaff_R15)->curr_func_item;
          if (pgVar18 == (gen_ctx *)0x0) {
            pgStack_100 = (gen_ctx *)0x152e78;
            bb_version_generator_cold_8();
            goto LAB_00152e78;
          }
          pgVar16 = *(gen_ctx **)(psVar3 + (long)pgVar41);
          pgVar22 = (gen_ctx *)((gen_ctx *)unaff_R15)->ctx;
          pgVar45 = (gen_ctx *)((long)&pgVar22->ctx + 1);
          pgVar26 = (gen_ctx *)psVar3[(long)pgVar41].mem_ref;
          if (*(gen_ctx **)&((gen_ctx *)unaff_R15)->optimize_level < pgVar45) {
            pcVar42 = (c2mir_ctx *)
                      ((long)pgVar45->call_used_hard_regs + (((ulong)pgVar45 >> 1) - 0x68));
            pgStack_100 = (gen_ctx *)0x15213e;
            pgVar39 = pgVar18;
            local_b8 = pgVar44;
            local_80 = (gen_ctx *)psVar3[(long)pgVar41].mem_ref;
            pgVar18 = (gen_ctx *)realloc(pgVar18,(long)pcVar42 * 0x10);
            ((gen_ctx *)unaff_R15)->curr_func_item = (MIR_item_t)pgVar18;
            *(c2mir_ctx **)&((gen_ctx *)unaff_R15)->optimize_level = pcVar42;
            pgVar22 = (gen_ctx *)((gen_ctx *)unaff_R15)->ctx;
            pgVar45 = (gen_ctx *)((long)&pgVar22->ctx + 1);
            pgVar44 = local_b8;
            pgVar26 = local_80;
          }
          ((gen_ctx *)unaff_R15)->ctx = (MIR_context_t)pgVar45;
          pgVar41 = (gen_ctx *)((long)&pgVar41->ctx + 1);
          pgVar18->call_used_hard_regs[(long)pgVar22 * 2 + -0xd] = (bitmap_t)pgVar16;
          pgVar18->call_used_hard_regs[(long)pgVar22 * 2 + -0xc] = (bitmap_t)pgVar26;
          pgVar26 = (gen_ctx *)((ulong)pgVar41 >> 6);
          pgVar18 = (gen_ctx *)pgVar20->ctx;
          pgVar22 = local_78;
        } while (pgVar26 < pgVar18);
      }
LAB_00152186:
      pVVar17 = gen_ctx->succ_bb_addrs;
      if ((pVVar17 == (VARR_void_ptr_t *)0x0) || (pVVar17->varr == (void_ptr_t *)0x0))
      goto LAB_00152dae;
      pVVar17->els_num = 0;
      pVVar2 = gen_ctx->spot_attrs;
      if (pVVar2 == (VARR_spot_attr_t *)0x0) goto LAB_00152dc7;
      pgStack_100 = (gen_ctx *)0x1521da;
      get_bb_version(gen_ctx,(bb_stub_t)((DLIST_MIR_item_t *)&local_c0->temp_bitmap3)->head->data,
                     (uint32_t)pVVar2->els_num,pVVar2->varr,0,(void **)local_a0);
      pgVar16 = (gen_ctx *)local_a0._0_8_;
      pVVar17 = gen_ctx->succ_bb_addrs;
      __ptr_00 = pVVar17->varr;
      if (__ptr_00 == (void_ptr_t *)0x0) goto LAB_00152dcc;
      sVar43 = pVVar17->els_num;
      uVar46 = sVar43 + 1;
      if (pVVar17->size < uVar46) {
        sVar43 = (uVar46 >> 1) + uVar46;
        pgStack_100 = (gen_ctx *)0x15221e;
        local_b8 = pgVar44;
        __ptr_00 = (void_ptr_t *)realloc(__ptr_00,sVar43 * 8);
        pVVar17->varr = __ptr_00;
        pVVar17->size = sVar43;
        sVar43 = pVVar17->els_num;
        uVar46 = sVar43 + 1;
        pgVar44 = local_b8;
      }
      pVVar17->els_num = uVar46;
      __ptr_00[sVar43] = pgVar16;
      if (gen_ctx->succ_bb_addrs == (VARR_void_ptr_t *)0x0) goto LAB_00152dd1;
      ppvVar34 = gen_ctx->succ_bb_addrs->varr;
      unaff_R15 = (char *)pgVar22;
    }
    else {
      ppvVar34 = (void **)0x0;
    }
    pgStack_100 = (gen_ctx *)0x152266;
    pgVar39 = gen_ctx;
    target_bb_insn_translate(gen_ctx,(MIR_insn_t)local_c0,ppvVar34);
    pgVar41 = local_a8;
LAB_0015226b:
    unaff_R13 = pgVar16;
    if (local_c0 == *(gen_ctx **)(local_a0._8_8_ + 0x20)) goto LAB_001523ca;
LAB_0015227f:
    pFVar15 = ((gen_ctx *)unaff_R15)->debug_file;
    pgVar44 = (gen_ctx *)&((gen_ctx *)unaff_R15)->debug_file;
    pgVar16 = unaff_R13;
    local_c0 = (gen_ctx *)unaff_R15;
    if (0xffffffd0 < (int)pFVar15 - 0xa5U) goto LAB_001523ca;
    goto LAB_00151a25;
  }
LAB_001523ca:
  pVVar2 = gen_ctx->spot_attrs;
  if ((pVVar2 == (VARR_spot_attr_t *)0x0) || (pVVar2->varr == (spot_attr_t *)0x0))
  goto LAB_00152df9;
  pVVar2->els_num = 0;
  pgVar39 = (gen_ctx *)gen_ctx->debug_file;
  local_b8 = pgVar44;
  if ((pgVar39 != (gen_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
    pgStack_100 = (gen_ctx *)0x152414;
    fprintf((FILE *)pgVar39,"  OUT BBStub%llx nonzero properties: ",local_a0._8_8_);
  }
  pgVar16 = (gen_ctx *)pgVar20->ctx;
  if (pgVar16 != (gen_ctx *)0x0) {
    pgVar18 = (gen_ctx *)0x0;
    pgVar44 = (gen_ctx *)0x0;
    do {
      unaff_R15 = "(spot=%u,prop=%u)";
      unaff_R13 = (gen_ctx *)0xffffff56;
      pgVar39 = (gen_ctx *)0x1bd05b;
      while ((pvVar23 = (&pgVar20->curr_func_item->data)[(long)pgVar18], pvVar23 == (void *)0x0 ||
             (uVar46 = (ulong)pvVar23 >> ((ulong)pgVar44 & 0x3f), uVar46 == 0))) {
        pgVar18 = (gen_ctx *)((long)&pgVar18->ctx + 1);
        pgVar44 = (gen_ctx *)((long)pgVar18 * 0x40);
        if (pgVar16 == pgVar18) goto LAB_001525d8;
      }
      uVar50 = uVar46 & 1;
      while (uVar50 == 0) {
        pgVar44 = (gen_ctx *)((long)&pgVar44->ctx + 1);
        uVar50 = uVar46 & 2;
        uVar46 = uVar46 >> 1;
      }
      if ((0xfffffffc < *(int *)&local_b8->ctx - 0xaaU) && (0x22 < (uint)pgVar44)) break;
      pVVar2 = gen_ctx->spot2attr;
      if ((pVVar2 == (VARR_spot_attr_t *)0x0) ||
         ((psVar3 = pVVar2->varr, psVar3 == (spot_attr_t *)0x0 ||
          ((gen_ctx *)pVVar2->els_num <= pgVar44)))) goto LAB_00152e2c;
      p_Var4 = *(_IO_FILE **)(psVar3 + (long)pgVar44);
      pgVar45 = (gen_ctx *)psVar3[(long)pgVar44].mem_ref;
      __s = (FILE *)gen_ctx->debug_file;
      local_90 = p_Var4;
      local_88 = pgVar45;
      if ((__s != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        if (gen_ctx->spot_attrs == (VARR_spot_attr_t *)0x0) goto LAB_00152ea0;
        local_b0 = pgVar45;
        if (gen_ctx->spot_attrs->els_num != 0) {
          pgStack_100 = (gen_ctx *)0x152515;
          fwrite(", ",2,1,__s);
          __s = (FILE *)gen_ctx->debug_file;
        }
        pgStack_100 = (gen_ctx *)0x152536;
        fprintf(__s,"(spot=%u,prop=%u)",(ulong)p_Var4 & 0xffffffff,(ulong)p_Var4 >> 0x20);
        pgVar45 = local_b0;
      }
      pgVar39 = (gen_ctx *)0x1bd05b;
      pgVar41 = (gen_ctx *)gen_ctx->spot_attrs;
      pMVar14 = pgVar41->curr_func_item;
      pgVar16 = unaff_R13;
      if (pMVar14 == (MIR_item_t)0x0) goto LAB_00152e7d;
      pMVar27 = pgVar41->ctx;
      pMVar28 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
      if (*(MIR_context_t *)&pgVar41->optimize_level < pMVar28) {
        p_Var53 = (_IO_FILE *)((long)&pMVar28->gen_ctx + ((ulong)pMVar28 >> 1));
        pgStack_100 = (gen_ctx *)0x152586;
        local_b0 = pgVar45;
        pMVar14 = (MIR_item_t)realloc(pMVar14,(long)p_Var53 * 0x10);
        pgVar41->curr_func_item = pMVar14;
        *(_IO_FILE **)&pgVar41->optimize_level = p_Var53;
        pMVar27 = pgVar41->ctx;
        pMVar28 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
        pgVar45 = local_b0;
      }
      unaff_R15 = "(spot=%u,prop=%u)";
      unaff_R13 = (gen_ctx *)0xffffff56;
      pgVar39 = (gen_ctx *)0x1bd05b;
      pgVar41->ctx = pMVar28;
      pgVar44 = (gen_ctx *)((long)&pgVar44->ctx + 1);
      (&pMVar14->data)[(long)pMVar27 * 2] = p_Var4;
      (&pMVar14->module)[(long)pMVar27 * 2] = (MIR_module_t)pgVar45;
      pgVar18 = (gen_ctx *)((ulong)pgVar44 >> 6);
      pgVar16 = (gen_ctx *)pgVar20->ctx;
    } while (pgVar18 < pgVar16);
  }
LAB_001525d8:
  pgVar45 = (gen_ctx *)gen_ctx->debug_file;
  if ((pgVar45 != (gen_ctx *)0x0) && (1 < gen_ctx->debug_level)) {
    pgVar39 = (gen_ctx *)0xa;
    pgStack_100 = (gen_ctx *)0x1525f2;
    fputc(10,(FILE *)pgVar45);
  }
  pgVar18 = local_b8;
  pVVar17 = gen_ctx->succ_bb_addrs;
  if ((pVVar17 == (VARR_void_ptr_t *)0x0) || (pVVar17->varr == (void_ptr_t *)0x0))
  goto LAB_00152dfe;
  pVVar17->els_num = 0;
  pgVar16 = (gen_ctx *)local_b8->ctx;
  iVar13 = (int)pgVar16;
  if (0x2e < iVar13 - 0x76U) {
    if (iVar13 == 0xa6) {
LAB_00152d65:
      ppvVar34 = (void **)0x0;
LAB_001526c4:
      pgStack_100 = (gen_ctx *)0x1526d1;
      pgVar45 = local_c0;
      pgVar39 = gen_ctx;
      target_bb_insn_translate(gen_ctx,(MIR_insn_t)local_c0,ppvVar34);
      pgVar16 = (gen_ctx *)(ulong)*(uint *)&pgVar18->ctx;
      pgVar44 = pgVar18;
    }
    else {
      pgVar44 = local_b8;
      if (iVar13 == 0xaa) {
        if ((ulong)pgVar16 >> 0x21 != 0) {
          pgVar20 = (gen_ctx *)&DAT_00000001;
          pgVar41 = (gen_ctx *)&local_c0->temp_bitmap3;
          pgVar16 = unaff_R13;
          do {
            unaff_R15 = local_a0;
            pVVar2 = gen_ctx->spot_attrs;
            pgVar44 = local_b8;
            if (pVVar2 == (VARR_spot_attr_t *)0x0) goto LAB_00152e87;
            pgVar45 = pgVar41->ctx->gen_ctx;
            pgStack_100 = (gen_ctx *)0x152cdb;
            pgVar39 = gen_ctx;
            get_bb_version(gen_ctx,(bb_stub_t)pgVar45,(uint32_t)pVVar2->els_num,pVVar2->varr,0,
                           (void **)unaff_R15);
            unaff_R13 = (gen_ctx *)local_a0._0_8_;
            pgVar44 = (gen_ctx *)gen_ctx->succ_bb_addrs;
            pgVar22 = (gen_ctx *)pgVar44->curr_func_item;
            if (pgVar22 == (gen_ctx *)0x0) goto LAB_00152e8c;
            pgVar26 = (gen_ctx *)pgVar44->ctx;
            pgVar16 = (gen_ctx *)((long)&pgVar26->ctx + 1);
            if (*(gen_ctx **)&pgVar44->optimize_level < pgVar16) {
              pcVar42 = (c2mir_ctx *)
                        ((long)pgVar16->call_used_hard_regs + (((ulong)pgVar16 >> 1) - 0x68));
              pgVar45 = (gen_ctx *)((long)pcVar42 * 8);
              pgStack_100 = (gen_ctx *)0x152d1b;
              pgVar39 = pgVar22;
              pgVar22 = (gen_ctx *)realloc(pgVar22,(size_t)pgVar45);
              pgVar44->curr_func_item = (MIR_item_t)pgVar22;
              *(c2mir_ctx **)&pgVar44->optimize_level = pcVar42;
              pgVar26 = (gen_ctx *)pgVar44->ctx;
              pgVar16 = (gen_ctx *)((long)&pgVar26->ctx + 1);
            }
            pgVar18 = local_b8;
            unaff_R15 = local_a0;
            pgVar44->ctx = (MIR_context_t)pgVar16;
            pgVar22->call_used_hard_regs[(long)((long)&pgVar26[-1].spot2attr + 3)] =
                 (bitmap_t)unaff_R13;
            pgVar20 = (gen_ctx *)((long)&pgVar20->ctx + 1);
            pgVar41 = (gen_ctx *)&pgVar41->addr_insn_p;
            pgVar16 = unaff_R13;
          } while (pgVar20 < (gen_ctx *)(ulong)*(uint *)((long)&local_b8->ctx + 4));
          pVVar17 = gen_ctx->succ_bb_addrs;
          if (pVVar17 == (VARR_void_ptr_t *)0x0) {
            pgStack_100 = (gen_ctx *)0x152d65;
            bb_version_generator_cold_16();
            goto LAB_00152d65;
          }
        }
LAB_001526c0:
        ppvVar34 = pVVar17->varr;
        goto LAB_001526c4;
      }
    }
    uVar25 = (int)pgVar16 - 0x76;
    if ((0x36 < uVar25) || ((0x71000000000001U >> ((ulong)uVar25 & 0x3f) & 1) == 0)) {
      pVVar17 = gen_ctx->succ_bb_addrs;
      pgVar16 = unaff_R13;
      if ((pVVar17 == (VARR_void_ptr_t *)0x0) || (pVVar17->varr == (void_ptr_t *)0x0))
      goto LAB_00152e82;
      pVVar17->els_num = 0;
      pVVar2 = gen_ctx->spot_attrs;
      if (pVVar2 == (VARR_spot_attr_t *)0x0) goto LAB_00152e91;
      pgVar45 = (gen_ctx *)(local_a0._8_8_ + 0x28);
      pgStack_100 = (gen_ctx *)0x152741;
      pgVar39 = gen_ctx;
      get_bb_version(gen_ctx,(bb_stub_t)pgVar45,(uint32_t)pVVar2->els_num,pVVar2->varr,0,
                     (void **)local_a0);
      pgVar41 = (gen_ctx *)gen_ctx->succ_bb_addrs;
      pgVar18 = (gen_ctx *)pgVar41->curr_func_item;
      if (pgVar18 == (gen_ctx *)0x0) goto LAB_00152e96;
      pMVar27 = pgVar41->ctx;
      pMVar28 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
      if (*(MIR_context_t *)&pgVar41->optimize_level < pMVar28) {
        pgVar20 = (gen_ctx *)((long)&pMVar28->gen_ctx + ((ulong)pMVar28 >> 1));
        pgVar45 = (gen_ctx *)((long)pgVar20 * 8);
        pgStack_100 = (gen_ctx *)0x152780;
        pgVar39 = pgVar18;
        pgVar18 = (gen_ctx *)realloc(pgVar18,(size_t)pgVar45);
        pgVar41->curr_func_item = (MIR_item_t)pgVar18;
        *(gen_ctx **)&pgVar41->optimize_level = pgVar20;
        pMVar27 = pgVar41->ctx;
        pMVar28 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
      }
      pgVar41->ctx = pMVar28;
      pgVar18->call_used_hard_regs[(long)((long)&pMVar27[-1].setjmp_addr + 3)] =
           (bitmap_t)local_a0._0_8_;
      unaff_R15 = (char *)local_a0._0_8_;
      if (gen_ctx->succ_bb_addrs == (VARR_void_ptr_t *)0x0) goto LAB_00152e9b;
      pgStack_100 = (gen_ctx *)0x1527d1;
      out_insn(gen_ctx,gen_ctx->target_ctx->temp_jump,
               patterns[gen_ctx->target_ctx->temp_jump_pat_ind].replacement,
               gen_ctx->succ_bb_addrs->varr);
    }
    while( true ) {
      ptVar19 = gen_ctx->target_ctx;
      pVVar1 = ptVar19->result_code;
      if (pVVar1 == (VARR_uint8_t *)0x0) break;
      uVar46 = pVVar1->els_num;
      if ((uVar46 & 0xf) == 0) {
        pVVar29 = ptVar19->const_refs;
        if (pVVar29 == (VARR_const_ref_t *)0x0) goto LAB_00152919;
        uVar46 = 0;
        goto LAB_0015283f;
      }
      puVar35 = pVVar1->varr;
      if (puVar35 == (uint8_t *)0x0) goto LAB_00152d9c;
      uVar50 = uVar46 + 1;
      if (pVVar1->size < uVar50) {
        __size = (uVar50 >> 1) + uVar50;
        pgStack_100 = (gen_ctx *)0x1527fe;
        puVar35 = (uint8_t *)realloc(puVar35,__size);
        pVVar1->varr = puVar35;
        pVVar1->size = __size;
        uVar46 = pVVar1->els_num;
        uVar50 = uVar46 + 1;
      }
      pVVar1->els_num = uVar50;
      puVar35[uVar46] = '\0';
    }
    goto LAB_00152d97;
  }
  pVVar2 = gen_ctx->spot_attrs;
  if (pVVar2 == (VARR_spot_attr_t *)0x0) goto LAB_00152e45;
  pgStack_100 = (gen_ctx *)0x15265b;
  get_bb_version(gen_ctx,(bb_stub_t)(*(VARR_char **)&local_c0->addr_insn_p)->els_num,
                 (uint32_t)pVVar2->els_num,pVVar2->varr,0,(void **)local_a0);
  unaff_R15 = (char *)local_a0._0_8_;
  pgVar41 = (gen_ctx *)gen_ctx->succ_bb_addrs;
  pMVar14 = pgVar41->curr_func_item;
  if (pMVar14 != (MIR_item_t)0x0) {
    pMVar27 = pgVar41->ctx;
    pMVar28 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
    if (*(MIR_context_t *)&pgVar41->optimize_level < pMVar28) {
      pgVar20 = (gen_ctx *)((long)&pMVar28->gen_ctx + ((ulong)pMVar28 >> 1));
      pgStack_100 = (gen_ctx *)0x15269a;
      pMVar14 = (MIR_item_t)realloc(pMVar14,(long)pgVar20 * 8);
      pgVar41->curr_func_item = pMVar14;
      *(gen_ctx **)&pgVar41->optimize_level = pgVar20;
      pMVar27 = pgVar41->ctx;
      pMVar28 = (MIR_context_t)((long)&pMVar27->gen_ctx + 1);
    }
    pgVar41->ctx = pMVar28;
    (&pMVar14->data)[(long)pMVar27] = unaff_R15;
    pVVar17 = gen_ctx->succ_bb_addrs;
    if (pVVar17 == (VARR_void_ptr_t *)0x0) goto LAB_00152e4f;
    goto LAB_001526c0;
  }
  goto LAB_00152e4a;
LAB_00152e2c:
  pgStack_100 = (gen_ctx *)0x152e31;
  bb_version_generator_cold_12();
LAB_00152e31:
  pgStack_100 = (gen_ctx *)0x152e36;
  bb_version_generator_cold_32();
LAB_00152e36:
  pgStack_100 = (gen_ctx *)0x152e3b;
  bb_version_generator_cold_25();
LAB_00152e3b:
  pgStack_100 = (gen_ctx *)0x152e40;
  bb_version_generator_cold_24();
  goto LAB_00152e40;
LAB_00152e7d:
  pgStack_100 = (gen_ctx *)0x152e82;
  bb_version_generator_cold_11();
LAB_00152e82:
  pgStack_100 = (gen_ctx *)0x152e87;
  bb_version_generator_cold_41();
LAB_00152e87:
  pgStack_100 = (gen_ctx *)0x152e8c;
  bb_version_generator_cold_18();
LAB_00152e8c:
  pgStack_100 = (gen_ctx *)0x152e91;
  bb_version_generator_cold_17();
LAB_00152e91:
  pgStack_100 = (gen_ctx *)0x152e96;
  bb_version_generator_cold_40();
LAB_00152e96:
  pgStack_100 = (gen_ctx *)0x152e9b;
  bb_version_generator_cold_39();
LAB_00152e9b:
  pgStack_100 = (gen_ctx *)0x152ea0;
  bb_version_generator_cold_38();
  unaff_R13 = pgVar16;
LAB_00152ea0:
  pgStack_100 = (gen_ctx *)0x152ea5;
  bb_version_generator_cold_10();
LAB_00152ea5:
  pgStack_100 = (gen_ctx *)MIR_gen_finish;
  bb_version_generator_cold_2();
  pMVar28 = pgVar39->ctx;
  pgVar18 = pgVar39;
  pgVar16 = (gen_ctx *)unaff_R15;
  pgStack_120 = pgVar41;
  pgStack_118 = pgVar20;
  pgStack_110 = unaff_R13;
  pgStack_108 = gen_ctx;
  pgStack_100 = (gen_ctx *)unaff_R15;
  if (pMVar28 != (MIR_context_t)0x0) {
    pgVar20 = (gen_ctx *)pMVar28[1].unspec_protos;
    pgVar16 = (gen_ctx *)pgVar20->ctx;
    if ((pgVar16 == (gen_ctx *)0x0) ||
       (pgVar18 = (gen_ctx *)pgVar16->curr_func_item, pgVar41 = pgVar39, pgVar18 == (gen_ctx *)0x0))
    {
LAB_00154352:
      pgStack_128 = (gen_ctx *)0x154357;
      MIR_gen_finish_cold_95();
      pgVar22 = pgVar18;
      pgVar18 = pgVar16;
LAB_00154357:
      pgVar26 = pgVar22;
      pgStack_128 = (gen_ctx *)0x15435c;
      MIR_gen_finish_cold_94();
LAB_0015435c:
      pgStack_128 = (gen_ctx *)0x154361;
      MIR_gen_finish_cold_93();
LAB_00154361:
      pgVar16 = pgVar26;
      pgStack_128 = (gen_ctx *)0x154366;
      MIR_gen_finish_cold_92();
LAB_00154366:
      pgStack_128 = (gen_ctx *)0x15436b;
      MIR_gen_finish_cold_91();
LAB_0015436b:
      pgVar22 = pgVar16;
      pgStack_128 = (gen_ctx *)0x154370;
      MIR_gen_finish_cold_90();
LAB_00154370:
      pgStack_128 = (gen_ctx *)0x154375;
      MIR_gen_finish_cold_89();
LAB_00154375:
      pgVar16 = pgVar22;
      pgStack_128 = (gen_ctx *)0x15437a;
      MIR_gen_finish_cold_88();
LAB_0015437a:
      pgStack_128 = (gen_ctx *)0x15437f;
      MIR_gen_finish_cold_87();
LAB_0015437f:
      pgStack_128 = (gen_ctx *)0x154384;
      MIR_gen_finish_cold_86();
LAB_00154384:
      pgVar22 = pgVar16;
      pgStack_128 = (gen_ctx *)0x154389;
      MIR_gen_finish_cold_85();
LAB_00154389:
      pgStack_128 = (gen_ctx *)0x15438e;
      MIR_gen_finish_cold_84();
LAB_0015438e:
      pgStack_128 = (gen_ctx *)0x154393;
      MIR_gen_finish_cold_83();
LAB_00154393:
      pgVar16 = pgVar22;
      pgStack_128 = (gen_ctx *)0x154398;
      MIR_gen_finish_cold_82();
LAB_00154398:
      pgStack_128 = (gen_ctx *)0x15439d;
      MIR_gen_finish_cold_81();
LAB_0015439d:
      pgStack_128 = (gen_ctx *)0x1543a2;
      MIR_gen_finish_cold_80();
LAB_001543a2:
      pgVar22 = pgVar16;
      pgStack_128 = (gen_ctx *)0x1543a7;
      MIR_gen_finish_cold_79();
LAB_001543a7:
      pgStack_128 = (gen_ctx *)0x1543ac;
      MIR_gen_finish_cold_78();
LAB_001543ac:
      pgStack_128 = (gen_ctx *)0x1543b1;
      MIR_gen_finish_cold_77();
LAB_001543b1:
      pgStack_128 = (gen_ctx *)0x1543b6;
      MIR_gen_finish_cold_76();
LAB_001543b6:
      pgVar16 = pgVar22;
      pgStack_128 = (gen_ctx *)0x1543bb;
      MIR_gen_finish_cold_75();
LAB_001543bb:
      pgStack_128 = (gen_ctx *)0x1543c0;
      MIR_gen_finish_cold_74();
LAB_001543c0:
      pgVar22 = pgVar16;
      pgStack_128 = (gen_ctx *)0x1543c5;
      MIR_gen_finish_cold_73();
LAB_001543c5:
      pgStack_128 = (gen_ctx *)0x1543ca;
      MIR_gen_finish_cold_72();
LAB_001543ca:
      pgVar16 = pgVar22;
      pgStack_128 = (gen_ctx *)0x1543cf;
      MIR_gen_finish_cold_71();
LAB_001543cf:
      pgStack_128 = (gen_ctx *)0x1543d4;
      MIR_gen_finish_cold_70();
LAB_001543d4:
      pgVar22 = pgVar16;
      pgStack_128 = (gen_ctx *)0x1543d9;
      MIR_gen_finish_cold_69();
LAB_001543d9:
      pgStack_128 = (gen_ctx *)0x1543de;
      MIR_gen_finish_cold_68();
LAB_001543de:
      pgVar16 = pgVar22;
      pgStack_128 = (gen_ctx *)0x1543e3;
      MIR_gen_finish_cold_67();
LAB_001543e3:
      pgStack_128 = (gen_ctx *)0x1543e8;
      MIR_gen_finish_cold_66();
LAB_001543e8:
      pgVar22 = pgVar16;
      pgStack_128 = (gen_ctx *)0x1543ed;
      MIR_gen_finish_cold_65();
LAB_001543ed:
      pgStack_128 = (gen_ctx *)0x1543f2;
      MIR_gen_finish_cold_64();
LAB_001543f2:
      pgVar16 = pgVar22;
      pgStack_128 = (gen_ctx *)0x1543f7;
      MIR_gen_finish_cold_63();
    }
    else {
      pgStack_128 = (gen_ctx *)0x152ee8;
      free(pgVar18);
      pgStack_128 = (gen_ctx *)0x152ef0;
      free(pgVar16);
      pgVar20->ctx = (MIR_context_t)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].unspec_protos;
      pgVar26 = *(gen_ctx **)&pgVar20->optimize_level;
      pgVar22 = pgVar16;
      pgVar18 = pgVar26;
      if ((pgVar26 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar26->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_00154357;
      pgStack_128 = (gen_ctx *)0x152f1f;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x152f27;
      free(pgVar26);
      *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
      pgVar18 = (gen_ctx *)(pMVar28[1].unspec_protos)->varr;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar26 = (gen_ctx *)pgVar18->curr_func_item, pgVar26 == (gen_ctx *)0x0))
      goto LAB_0015435c;
      pgStack_128 = (gen_ctx *)0x152f56;
      free(pgVar26);
      pgStack_128 = (gen_ctx *)0x152f5e;
      free(pgVar18);
      pgVar26 = (gen_ctx *)pMVar28[1].unspec_protos;
      pgStack_128 = (gen_ctx *)0x152f6a;
      free(pgVar26);
      pMVar28[1].unspec_protos = (VARR_MIR_proto_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar16 = (gen_ctx *)pgVar20->ctx;
      pgVar18 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar26 = (gen_ctx *)pgVar16->curr_func_item, pgVar26 == (gen_ctx *)0x0))
      goto LAB_00154361;
      pgStack_128 = (gen_ctx *)0x152f9b;
      free(pgVar26);
      pgStack_128 = (gen_ctx *)0x152fa3;
      free(pgVar16);
      pgVar20->ctx = (MIR_context_t)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar18 = *(gen_ctx **)&pgVar20->optimize_level;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_00154366;
      pgStack_128 = (gen_ctx *)0x152fd2;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x152fda;
      free(pgVar18);
      *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar22 = (gen_ctx *)pgVar20->curr_func_item;
      pgVar16 = pgVar18;
      pgVar18 = pgVar22;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_0015436b;
      pgStack_128 = (gen_ctx *)0x15300a;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x153012;
      free(pgVar22);
      pgVar20->curr_func_item = (MIR_item_t)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar18 = (gen_ctx *)pgVar20->debug_file;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_00154370;
      pgStack_128 = (gen_ctx *)0x153042;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x15304a;
      free(pgVar18);
      pgVar20->debug_file = (FILE *)0x0;
      unaff_R13 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar20 = *(gen_ctx **)&unaff_R13->debug_level;
      pgVar22 = pgVar18;
      pgVar18 = pgVar20;
      if ((VARR_MIR_proto_t *)pgVar20->to_free != (VARR_MIR_proto_t *)0x0) {
        pgStack_128 = (gen_ctx *)0x15306d;
        HTAB_def_tab_el_t_clear((HTAB_def_tab_el_t *)pgVar20);
        pgVar18 = *(gen_ctx **)&unaff_R13->debug_level;
        pgVar22 = pgVar20;
      }
      pgVar16 = *(gen_ctx **)&pgVar18->addr_insn_p;
      pgVar20 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_00154375;
      pgStack_128 = (gen_ctx *)0x153091;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x153099;
      free(pgVar16);
      *(VARR_char **)&pgVar18->addr_insn_p = (VARR_char *)0x0;
      pgVar20 = *(gen_ctx **)&unaff_R13->debug_level;
      pgVar18 = (gen_ctx *)pgVar20->tied_regs;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_0015437a;
      pgStack_128 = (gen_ctx *)0x1530c5;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x1530cd;
      free(pgVar18);
      pgVar20->tied_regs = (bitmap_t)0x0;
      pgVar16 = *(gen_ctx **)&unaff_R13->debug_level;
      pgStack_128 = (gen_ctx *)0x1530de;
      free(pgVar16);
      *(VARR_size_t **)&unaff_R13->debug_level = (VARR_size_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar18 = (gen_ctx *)pgVar20->to_free;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_0015437f;
      pgStack_128 = (gen_ctx *)0x153109;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x153111;
      free(pgVar18);
      pgVar20->to_free = (VARR_void_ptr_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar22 = *(gen_ctx **)&pgVar20->addr_insn_p;
      pgVar16 = pgVar18;
      pgVar18 = pgVar22;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_00154384;
      pgStack_128 = (gen_ctx *)0x153141;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x153149;
      free(pgVar22);
      *(VARR_char **)&pgVar20->addr_insn_p = (VARR_char *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_string;
      pgVar18 = (gen_ctx *)pgVar20->tied_regs;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_00154389;
      pgStack_128 = (gen_ctx *)0x153179;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x153181;
      free(pgVar18);
      pgVar20->tied_regs = (bitmap_t)0x0;
      pgVar22 = (gen_ctx *)pMVar28[1].temp_string;
      pgStack_128 = (gen_ctx *)0x153195;
      free(pgVar22);
      pMVar28[1].temp_string = (VARR_char *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_data;
      pgVar18 = *(gen_ctx **)&pgVar20->optimize_level;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_0015438e;
      pgStack_128 = (gen_ctx *)0x1531c3;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1531cb;
      free(pgVar18);
      *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
      unaff_R13 = (gen_ctx *)pMVar28[1].temp_data;
      pgVar20 = (gen_ctx *)unaff_R13->debug_file;
      pgVar22 = pgVar18;
      pgVar18 = pgVar20;
      if ((VARR_MIR_proto_t *)pgVar20->to_free != (VARR_MIR_proto_t *)0x0) {
        pgStack_128 = (gen_ctx *)0x1531ee;
        HTAB_expr_t_clear((HTAB_expr_t *)pgVar20);
        pgVar18 = (gen_ctx *)unaff_R13->debug_file;
        pgVar22 = pgVar20;
      }
      pgVar16 = *(gen_ctx **)&pgVar18->addr_insn_p;
      pgVar20 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_00154393;
      pgStack_128 = (gen_ctx *)0x153212;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x15321a;
      free(pgVar16);
      *(VARR_char **)&pgVar18->addr_insn_p = (VARR_char *)0x0;
      pgVar20 = (gen_ctx *)unaff_R13->debug_file;
      pgVar18 = (gen_ctx *)pgVar20->tied_regs;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_00154398;
      pgStack_128 = (gen_ctx *)0x153246;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x15324e;
      free(pgVar18);
      pgVar20->tied_regs = (bitmap_t)0x0;
      pgStack_128 = (gen_ctx *)0x15325f;
      free(unaff_R13->debug_file);
      unaff_R13->debug_file = (FILE *)0x0;
      pgVar16 = (gen_ctx *)(pMVar28[1].temp_data)->els_num;
      pgStack_128 = (gen_ctx *)0x153272;
      free(pgVar16);
      pgVar20 = (gen_ctx *)pMVar28[1].temp_data;
      pgVar18 = (gen_ctx *)pgVar20->curr_func_item;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_0015439d;
      pgStack_128 = (gen_ctx *)0x153299;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x1532a1;
      free(pgVar18);
      pgVar20->curr_func_item = (MIR_item_t)0x0;
      unaff_R13 = (gen_ctx *)pMVar28[1].temp_data;
      pgVar20 = *(gen_ctx **)&unaff_R13->debug_level;
      pgVar16 = pgVar18;
      pgVar18 = pgVar20;
      if ((VARR_MIR_proto_t *)pgVar20->to_free != (VARR_MIR_proto_t *)0x0) {
        pgStack_128 = (gen_ctx *)0x1532c4;
        HTAB_mem_expr_t_clear((HTAB_mem_expr_t *)pgVar20);
        pgVar18 = *(gen_ctx **)&unaff_R13->debug_level;
        pgVar16 = pgVar20;
      }
      pgVar22 = *(gen_ctx **)&pgVar18->addr_insn_p;
      pgVar20 = pgVar22;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543a2;
      pgStack_128 = (gen_ctx *)0x1532e8;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x1532f0;
      free(pgVar22);
      *(VARR_char **)&pgVar18->addr_insn_p = (VARR_char *)0x0;
      pgVar20 = *(gen_ctx **)&unaff_R13->debug_level;
      pgVar18 = (gen_ctx *)pgVar20->tied_regs;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543a7;
      pgStack_128 = (gen_ctx *)0x15331c;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x153324;
      free(pgVar18);
      pgVar20->tied_regs = (bitmap_t)0x0;
      pgVar22 = *(gen_ctx **)&unaff_R13->debug_level;
      pgStack_128 = (gen_ctx *)0x153335;
      free(pgVar22);
      *(VARR_size_t **)&unaff_R13->debug_level = (VARR_size_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].temp_data;
      pgVar18 = (gen_ctx *)pgVar20->to_free;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543ac;
      pgStack_128 = (gen_ctx *)0x153360;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x153368;
      free(pgVar18);
      pgVar20->to_free = (VARR_void_ptr_t *)0x0;
      pgVar22 = (gen_ctx *)pMVar28[1].temp_data;
      pgStack_128 = (gen_ctx *)0x15337c;
      free(pgVar22);
      pMVar28[1].temp_data = (VARR_uint8_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].used_label_p;
      pgVar18 = (gen_ctx *)pgVar20->temp_bitmap2;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543b1;
      pgStack_128 = (gen_ctx *)0x1533aa;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1533b2;
      free(pgVar18);
      pgVar20->temp_bitmap2 = (bitmap_t)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].used_label_p;
      pgVar16 = (gen_ctx *)((DLIST_MIR_item_t *)&pgVar20->temp_bitmap3)->head;
      pgVar22 = pgVar18;
      pgVar18 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543b6;
      pgStack_128 = (gen_ctx *)0x1533e2;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1533ea;
      free(pgVar16);
      ((DLIST_MIR_item_t *)&pgVar20->temp_bitmap3)->head = (MIR_item_t_conflict)0x0;
      pgVar18 = (gen_ctx *)pMVar28[1].used_label_p[2].els_num;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543bb;
      pgStack_128 = (gen_ctx *)0x153419;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x153421;
      free(pgVar18);
      pgVar22 = (gen_ctx *)pMVar28[1].used_label_p[2].size;
      pgVar16 = pgVar18;
      pgVar18 = pgVar22;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543c0;
      pgStack_128 = (gen_ctx *)0x153447;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x15344f;
      free(pgVar22);
      pgVar18 = (gen_ctx *)pMVar28[1].used_label_p[2].varr;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543c5;
      pgStack_128 = (gen_ctx *)0x153475;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x15347d;
      free(pgVar18);
      pgVar16 = (gen_ctx *)pMVar28[1].used_label_p[3].els_num;
      pgVar22 = pgVar18;
      pgVar18 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543ca;
      pgStack_128 = (gen_ctx *)0x1534a3;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1534ab;
      free(pgVar16);
      pgVar18 = (gen_ctx *)pMVar28[1].used_label_p[3].size;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543cf;
      pgStack_128 = (gen_ctx *)0x1534d1;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x1534d9;
      free(pgVar18);
      pgVar20 = (gen_ctx *)pMVar28[1].used_label_p;
      pFVar15 = pgVar20->debug_file;
      while (pFVar15 != (FILE *)0x0) {
        pgVar20->debug_file = (FILE *)pFVar15->_IO_read_base;
        pgStack_128 = (gen_ctx *)0x1534fd;
        free(pFVar15);
        pgVar20 = (gen_ctx *)pMVar28[1].used_label_p;
        pFVar15 = pgVar20->debug_file;
      }
      __ptr = *(VARR_size_t **)&pgVar20->debug_level;
      while (__ptr != (VARR_size_t *)0x0) {
        *(VARR_size_t **)&pgVar20->debug_level = (VARR_size_t *)__ptr->size;
        pgStack_128 = (gen_ctx *)0x153530;
        free(__ptr);
        pgVar20 = (gen_ctx *)pMVar28[1].used_label_p;
        __ptr = *(VARR_size_t **)&pgVar20->debug_level;
      }
      pgVar22 = *(gen_ctx **)&pgVar20->optimize_level;
      pgVar16 = (gen_ctx *)0x0;
      pgVar18 = pgVar22;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543d4;
      pgStack_128 = (gen_ctx *)0x153566;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x15356e;
      free(pgVar22);
      *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].used_label_p;
      pgVar18 = (gen_ctx *)pgVar20->curr_func_item;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543d9;
      pgStack_128 = (gen_ctx *)0x15359e;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1535a6;
      free(pgVar18);
      pgVar20->curr_func_item = (MIR_item_t)0x0;
      pgVar22 = (gen_ctx *)pMVar28[1].used_label_p;
      pgStack_128 = (gen_ctx *)0x1535ba;
      free(pgVar22);
      pMVar28[1].used_label_p = (VARR_uint8_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].module_item_tab;
      pgVar16 = (gen_ctx *)pgVar20->ctx;
      pgVar18 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543de;
      pgStack_128 = (gen_ctx *)0x1535e7;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1535ef;
      free(pgVar16);
      pgVar20->ctx = (MIR_context_t)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].module_item_tab;
      pgVar18 = *(gen_ctx **)&pgVar20->optimize_level;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543e3;
      pgStack_128 = (gen_ctx *)0x15361e;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x153626;
      free(pgVar18);
      *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].module_item_tab;
      pgVar22 = (gen_ctx *)pgVar20->curr_func_item;
      pgVar16 = pgVar18;
      pgVar18 = pgVar22;
      if ((pgVar22 == (gen_ctx *)0x0) ||
         (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0))
      goto LAB_001543e8;
      pgStack_128 = (gen_ctx *)0x153656;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x15365e;
      free(pgVar22);
      pgVar20->curr_func_item = (MIR_item_t)0x0;
      pgVar18 = (gen_ctx *)(pMVar28[1].module_item_tab)->hash_func;
      if ((pgVar18 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543ed;
      pgStack_128 = (gen_ctx *)0x15368d;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x153695;
      free(pgVar18);
      pgVar22 = (gen_ctx *)pMVar28[1].module_item_tab;
      pgStack_128 = (gen_ctx *)0x1536a1;
      free(pgVar22);
      pMVar28[1].module_item_tab = (HTAB_MIR_item_t *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
      pgVar16 = *(gen_ctx **)&pgVar20->optimize_level;
      pgVar18 = pgVar16;
      if ((pgVar16 == (gen_ctx *)0x0) ||
         (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0))
      goto LAB_001543f2;
      pgStack_128 = (gen_ctx *)0x1536d3;
      free(pgVar22);
      pgStack_128 = (gen_ctx *)0x1536db;
      free(pgVar16);
      *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
      pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
      pgVar18 = (gen_ctx *)pgVar20->curr_func_item;
      if ((pgVar18 != (gen_ctx *)0x0) &&
         (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 != (gen_ctx *)0x0)) {
        pgStack_128 = (gen_ctx *)0x15370b;
        free(pgVar16);
        pgStack_128 = (gen_ctx *)0x153713;
        free(pgVar18);
        pgVar20->curr_func_item = (MIR_item_t)0x0;
        while( true ) {
          pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
          pgVar16 = (gen_ctx *)pgVar20->debug_file;
          if (pgVar16 == (gen_ctx *)0x0) break;
          pgVar22 = (gen_ctx *)pgVar16->ctx;
          if (pgVar22 == (gen_ctx *)0x0) {
            pgVar18 = (gen_ctx *)pgVar16->curr_func_item;
            if (pgVar18 == (gen_ctx *)0x0) goto LAB_001544d8;
            pgStack_128 = (gen_ctx *)0x153789;
            free(pgVar18);
            pgStack_128 = (gen_ctx *)0x153791;
            free(pgVar16);
            pgVar20->debug_file = (FILE *)0x0;
            pgVar18 = pgVar16;
            goto LAB_0015379a;
          }
          if (pgVar16->curr_func_item == (MIR_item_t)0x0) goto LAB_00154339;
          pgVar16->ctx = (MIR_context_t)((long)&pgVar22[-1].spot_attrs + 7);
          pgVar16 = *(gen_ctx **)((long)pgVar16->curr_func_item + (long)pgVar22 * 8 + -8);
          if ((pgVar16 == (gen_ctx *)0x0) ||
             (pgVar18 = (gen_ctx *)pgVar16->curr_func_item, pgVar18 == (gen_ctx *)0x0))
          goto LAB_00154311;
          pgStack_128 = (gen_ctx *)0x15376d;
          free(pgVar18);
          pgStack_128 = (gen_ctx *)0x153775;
          free(pgVar16);
          pgVar18 = pgVar16;
        }
        goto LAB_0015432a;
      }
    }
    pgStack_128 = (gen_ctx *)0x1543fc;
    MIR_gen_finish_cold_62();
    pgVar39 = pgVar41;
LAB_001543fc:
    pgStack_128 = (gen_ctx *)0x154401;
    MIR_gen_finish_cold_55();
LAB_00154401:
    pgVar22 = pgVar16;
    pgStack_128 = (gen_ctx *)0x154406;
    MIR_gen_finish_cold_54();
LAB_00154406:
    pgStack_128 = (gen_ctx *)0x15440b;
    MIR_gen_finish_cold_53();
    goto LAB_0015440b;
  }
  goto LAB_001544d3;
LAB_0015379a:
  pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
  pgVar16 = *(gen_ctx **)&pgVar20->debug_level;
  if (pgVar16 == (gen_ctx *)0x0) goto LAB_0015432f;
  pgVar22 = (gen_ctx *)pgVar16->ctx;
  if (pgVar22 == (gen_ctx *)0x0) {
    pgVar18 = (gen_ctx *)pgVar16->curr_func_item;
    if (pgVar18 == (gen_ctx *)0x0) goto LAB_001544dd;
    pgStack_128 = (gen_ctx *)0x153807;
    free(pgVar18);
    pgStack_128 = (gen_ctx *)0x15380f;
    free(pgVar16);
    *(VARR_size_t **)&pgVar20->debug_level = (VARR_size_t *)0x0;
    pgVar18 = pgVar16;
    goto LAB_00153818;
  }
  if (pgVar16->curr_func_item == (MIR_item_t)0x0) goto LAB_0015433e;
  pgVar16->ctx = (MIR_context_t)((long)&pgVar22[-1].spot_attrs + 7);
  pgVar16 = *(gen_ctx **)((long)pgVar16->curr_func_item + (long)pgVar22 * 8 + -8);
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar18 = (gen_ctx *)pgVar16->curr_func_item, pgVar18 == (gen_ctx *)0x0)) goto LAB_00154316;
  pgStack_128 = (gen_ctx *)0x1537eb;
  free(pgVar18);
  pgStack_128 = (gen_ctx *)0x1537f3;
  free(pgVar16);
  pgVar18 = pgVar16;
  goto LAB_0015379a;
LAB_00153818:
  pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
  pgVar16 = (gen_ctx *)pgVar20->to_free;
  if (pgVar16 == (gen_ctx *)0x0) goto LAB_00154334;
  pgVar22 = (gen_ctx *)pgVar16->ctx;
  if (pgVar22 == (gen_ctx *)0x0) {
    pgVar18 = (gen_ctx *)pgVar16->curr_func_item;
    if (pgVar18 == (gen_ctx *)0x0) goto LAB_001544e2;
    pgStack_128 = (gen_ctx *)0x153885;
    free(pgVar18);
    pgStack_128 = (gen_ctx *)0x15388d;
    free(pgVar16);
    pgVar20->to_free = (VARR_void_ptr_t *)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
    pgVar18 = *(gen_ctx **)&pgVar20->addr_insn_p;
    if ((pgVar18 == (gen_ctx *)0x0) ||
       (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_001543fc;
    pgStack_128 = (gen_ctx *)0x1538bd;
    free(pgVar16);
    pgStack_128 = (gen_ctx *)0x1538c5;
    free(pgVar18);
    *(VARR_char **)&pgVar20->addr_insn_p = (VARR_char *)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
    pgVar22 = (gen_ctx *)pgVar20->tied_regs;
    pgVar16 = pgVar18;
    pgVar18 = pgVar22;
    if ((pgVar22 == (gen_ctx *)0x0) ||
       (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154401;
    pgStack_128 = (gen_ctx *)0x1538f5;
    free(pgVar16);
    pgStack_128 = (gen_ctx *)0x1538fd;
    free(pgVar22);
    pgVar20->tied_regs = (bitmap_t)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
    pgVar18 = (gen_ctx *)pgVar20->lr_ctx;
    if ((pgVar18 == (gen_ctx *)0x0) ||
       (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154406;
    pgStack_128 = (gen_ctx *)0x153930;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x153938;
    free(pgVar18);
    pgVar20->lr_ctx = (lr_ctx *)0x0;
    pgVar20 = (gen_ctx *)0x8;
    goto LAB_0015394a;
  }
  if (pgVar16->curr_func_item == (MIR_item_t)0x0) goto LAB_00154348;
  pgVar16->ctx = (MIR_context_t)((long)&pgVar22[-1].spot_attrs + 7);
  pgVar16 = *(gen_ctx **)((long)pgVar16->curr_func_item + (long)pgVar22 * 8 + -8);
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar18 = (gen_ctx *)pgVar16->curr_func_item, pgVar18 == (gen_ctx *)0x0)) goto LAB_0015431b;
  pgStack_128 = (gen_ctx *)0x153869;
  free(pgVar18);
  pgStack_128 = (gen_ctx *)0x153871;
  free(pgVar16);
  pgVar18 = pgVar16;
  goto LAB_00153818;
code_r0x00153c1c:
  pgStack_128 = (gen_ctx *)0x153c21;
  free(pgVar18);
  pgStack_128 = (gen_ctx *)0x153c29;
  free(pgVar16);
  pgVar20 = (gen_ctx *)((long)&pgVar20->ctx + 1);
  pgVar18 = pgVar16;
  if (pgVar20 == (gen_ctx *)0x20) goto code_r0x00153c32;
  goto LAB_00153c02;
code_r0x00153c32:
  pgVar22 = (gen_ctx *)pMVar28->temp_data;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_0015443d;
  pgStack_128 = (gen_ctx *)0x153c51;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153c59;
  free(pgVar22);
  pgVar18 = (gen_ctx *)pMVar28->used_label_p;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154442;
  pgStack_128 = (gen_ctx *)0x153c78;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153c80;
  free(pgVar18);
  pgVar16 = (gen_ctx *)pMVar28->module_item_tab;
  pgVar22 = pgVar18;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154447;
  pgStack_128 = (gen_ctx *)0x153c9f;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153ca7;
  free(pgVar16);
  pgVar18 = (gen_ctx *)pMVar28->interp_ctx;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_0015444c;
  pgStack_128 = (gen_ctx *)0x153cc9;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153cd1;
  free(pgVar18);
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar22 = (gen_ctx *)pgVar20->debug_file;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154451;
  pgStack_128 = (gen_ctx *)0x153cf8;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153d00;
  free(pgVar22);
  pgVar20->debug_file = (FILE *)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar18 = (gen_ctx *)pgVar20->to_free;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154456;
  pgStack_128 = (gen_ctx *)0x153d30;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153d38;
  free(pgVar18);
  pgVar20->to_free = (VARR_void_ptr_t *)0x0;
  pgVar22 = pMVar28->gen_ctx;
  pgVar45 = (gen_ctx *)(pMVar28[1].insn_nops)->size;
  pgStack_128 = (gen_ctx *)0x153d54;
  _MIR_free_insn((MIR_context_t)pgVar22,(MIR_insn_t_conflict)pgVar45);
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar16 = *(gen_ctx **)&pgVar20->addr_insn_p;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015445b;
  pgStack_128 = (gen_ctx *)0x153d7b;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153d83;
  free(pgVar16);
  *(VARR_char **)&pgVar20->addr_insn_p = (VARR_char *)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar18 = *(gen_ctx **)&pgVar20->debug_level;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154460;
  pgStack_128 = (gen_ctx *)0x153db3;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153dbb;
  free(pgVar18);
  *(VARR_size_t **)&pgVar20->debug_level = (VARR_size_t *)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar22 = (gen_ctx *)pgVar20->tied_regs;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154465;
  pgStack_128 = (gen_ctx *)0x153deb;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153df3;
  free(pgVar22);
  pgVar20->tied_regs = (bitmap_t)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar18 = (gen_ctx *)pgVar20->addr_regs;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015446a;
  pgStack_128 = (gen_ctx *)0x153e23;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153e2b;
  free(pgVar18);
  pgVar20->addr_regs = (bitmap_t)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar16 = (gen_ctx *)pgVar20->insn_to_consider;
  pgVar22 = pgVar18;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015446f;
  pgStack_128 = (gen_ctx *)0x153e5b;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153e63;
  free(pgVar16);
  pgVar20->insn_to_consider = (bitmap_t)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar18 = (gen_ctx *)((MIR_module *)&pgVar20->temp_bitmap)->data;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154474;
  pgStack_128 = (gen_ctx *)0x153e93;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153e9b;
  free(pgVar18);
  ((MIR_module *)&pgVar20->temp_bitmap)->data = (char *)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar22 = (gen_ctx *)pgVar20->temp_bitmap2;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154479;
  pgStack_128 = (gen_ctx *)0x153ecb;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153ed3;
  free(pgVar22);
  pgVar20->temp_bitmap2 = (bitmap_t)0x0;
  pgVar20 = (gen_ctx *)pMVar28[1].insn_nops;
  pgVar18 = (gen_ctx *)((DLIST_MIR_item_t *)&pgVar20->temp_bitmap3)->head;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015447e;
  pgStack_128 = (gen_ctx *)0x153f03;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153f0b;
  free(pgVar18);
  ((DLIST_MIR_item_t *)&pgVar20->temp_bitmap3)->head = (MIR_item_t_conflict)0x0;
  pgStack_128 = (gen_ctx *)0x153f1f;
  free(pMVar28[1].insn_nops);
  pMVar28[1].insn_nops = (VARR_size_t *)0x0;
  pgVar18 = pMVar28[1].gen_ctx;
  if (pgVar18 != (gen_ctx *)0x0) {
    pgVar16 = (gen_ctx *)(pMVar28 + 1);
    pgVar20 = (gen_ctx *)&pMVar28[1].c2mir_ctx;
    do {
      pcVar42 = *(c2mir_ctx **)&pgVar18->optimize_level;
      pgVar22 = (gen_ctx *)pgVar18->curr_func_item;
      pgVar26 = (gen_ctx *)(pcVar42 + 0x10);
      if (pcVar42 == (c2mir_ctx *)0x0) {
        pgVar26 = pgVar16;
      }
      pgVar26->ctx = (MIR_context_t)pgVar22;
      if (pgVar22 == (gen_ctx *)0x0) {
        ppcVar31 = (c2mir_ctx **)pgVar20;
        if (*(gen_ctx **)pgVar20 != pgVar18) goto LAB_0015434d;
      }
      else {
        ppcVar31 = (c2mir_ctx **)&pgVar22->optimize_level;
      }
      *ppcVar31 = pcVar42;
      pgStack_128 = (gen_ctx *)0x153f76;
      free(pgVar18);
      pgVar18 = (gen_ctx *)pgVar16->ctx;
    } while (pgVar18 != (gen_ctx *)0x0);
  }
  pgVar22 = (gen_ctx *)pMVar28[1].unspec_protos;
  pgStack_128 = (gen_ctx *)0x153f8a;
  free(pgVar22);
  pgVar16 = (gen_ctx *)(pMVar28->environment_module).data;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154483;
  pgStack_128 = (gen_ctx *)0x153fa9;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x153fb1;
  free(pgVar16);
  pgVar18 = (gen_ctx *)(pMVar28->environment_module).name;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154488;
  pgStack_128 = (gen_ctx *)0x153fd0;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153fd8;
  free(pgVar18);
  pgVar22 = (gen_ctx *)(pMVar28->environment_module).items.head;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_0015448d;
  pgStack_128 = (gen_ctx *)0x153ff7;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x153fff;
  free(pgVar22);
  pgVar18 = (gen_ctx *)pMVar28[1].environment_module.items.head;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154492;
  pgStack_128 = (gen_ctx *)0x154021;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x154029;
  free(pgVar18);
  pMVar28[1].environment_module.items.head = (MIR_item_t_conflict)0x0;
  pgVar16 = (gen_ctx *)pMVar28[1].environment_module.items.tail;
  pgVar22 = pgVar18;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154497;
  pgStack_128 = (gen_ctx *)0x154056;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x15405e;
  free(pgVar16);
  pMVar28[1].environment_module.items.tail = (MIR_item_t_conflict)0x0;
  pgVar18 = (gen_ctx *)pMVar28[1].environment_module.module_link.prev;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_0015449c;
  pgStack_128 = (gen_ctx *)0x15408b;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x154093;
  free(pgVar18);
  pMVar28[1].environment_module.module_link.prev = (MIR_module_t)0x0;
  pgVar22 = (gen_ctx *)pMVar28[1].environment_module.module_link.next;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_001544a1;
  pgStack_128 = (gen_ctx *)0x1540c0;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x1540c8;
  free(pgVar22);
  pMVar28[1].environment_module.module_link.next = (MIR_module_t)0x0;
  pgVar18 = *(gen_ctx **)&pMVar28[1].environment_module.last_temp_item_num;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_001544a6;
  pgStack_128 = (gen_ctx *)0x1540f5;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x1540fd;
  free(pgVar18);
  *(undefined8 *)&pMVar28[1].environment_module.last_temp_item_num = 0;
  pgVar16 = (gen_ctx *)pMVar28[1].curr_module;
  pgVar22 = pgVar18;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_001544ab;
  pgStack_128 = (gen_ctx *)0x15412a;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x154132;
  free(pgVar16);
  pMVar28[1].curr_module = (MIR_module_t_conflict)0x0;
  pgVar18 = (gen_ctx *)pMVar28[1].curr_func;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_001544b0;
  pgStack_128 = (gen_ctx *)0x15415f;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x154167;
  free(pgVar18);
  pMVar28[1].curr_func = (MIR_func_t)0x0;
  pgVar22 = (gen_ctx *)pMVar28[1].curr_label_num;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_001544b5;
  pgStack_128 = (gen_ctx *)0x154194;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x15419c;
  free(pgVar22);
  pMVar28[1].curr_label_num = 0;
  pgVar18 = (gen_ctx *)pMVar28[1].all_modules.tail;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_001544ba;
  pgStack_128 = (gen_ctx *)0x1541c9;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x1541d1;
  free(pgVar18);
  pMVar28[1].all_modules.tail = (MIR_module_t_conflict)0x0;
  pgVar16 = (gen_ctx *)pMVar28[1].string_ctx;
  pgVar22 = pgVar18;
  pgVar18 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_001544bf;
  pgStack_128 = (gen_ctx *)0x1541fe;
  free(pgVar22);
  pgStack_128 = (gen_ctx *)0x154206;
  free(pgVar16);
  pMVar28[1].string_ctx = (string_ctx *)0x0;
  pgVar18 = (gen_ctx *)pMVar28[1].reg_ctx;
  if ((pgVar18 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_001544c4;
  pgStack_128 = (gen_ctx *)0x154233;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x15423b;
  free(pgVar18);
  pMVar28[1].reg_ctx = (reg_ctx *)0x0;
  pgVar22 = (gen_ctx *)pMVar28[1].machine_code_ctx;
  pgVar16 = pgVar18;
  pgVar18 = pgVar22;
  if ((pgVar22 == (gen_ctx *)0x0) ||
     (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_001544c9;
  pgStack_128 = (gen_ctx *)0x154268;
  free(pgVar16);
  pgStack_128 = (gen_ctx *)0x154270;
  free(pgVar22);
  pMVar28[1].machine_code_ctx = (machine_code_ctx *)0x0;
  pgVar18 = (gen_ctx *)pMVar28[1].simplify_ctx;
  pgVar16 = pgVar18;
  if ((pgVar18 != (gen_ctx *)0x0) &&
     (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 != (gen_ctx *)0x0)) {
    pgStack_128 = (gen_ctx *)0x15429d;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x1542a5;
    free(pgVar18);
    pMVar28[1].simplify_ctx = (simplify_ctx *)0x0;
    while (pgVar16 = (gen_ctx *)pMVar28->unspec_protos, pgVar16 != (gen_ctx *)0x0) {
      pgVar22 = (gen_ctx *)pgVar16->ctx;
      pgVar18 = (gen_ctx *)pgVar16->curr_func_item;
      if (pgVar22 == (gen_ctx *)0x0) {
        if (pgVar18 != (gen_ctx *)0x0) {
          pgStack_128 = (gen_ctx *)0x1542eb;
          free(pgVar18);
          pgStack_128 = (gen_ctx *)0x1542f3;
          free(pgVar16);
          pgStack_128 = (gen_ctx *)0x1542fb;
          free(pMVar28);
          pgVar39->ctx = (MIR_context_t)0x0;
          return extraout_RAX_01;
        }
        goto LAB_001544e7;
      }
      if (pgVar18 == (gen_ctx *)0x0) goto LAB_00154325;
      pgVar16->ctx = (MIR_context_t)((long)&pgVar22[-1].spot_attrs + 7);
      pgVar18 = (gen_ctx *)pgVar18->call_used_hard_regs[(long)((long)&pgVar22[-1].spot2attr + 2)];
      pgStack_128 = (gen_ctx *)0x1542db;
      free(pgVar18);
    }
LAB_00154320:
    pgStack_128 = (gen_ctx *)0x154325;
    MIR_gen_finish_cold_11();
LAB_00154325:
    pgStack_128 = (gen_ctx *)0x15432a;
    MIR_gen_finish_cold_9();
LAB_0015432a:
    pgStack_128 = (gen_ctx *)0x15432f;
    MIR_gen_finish_cold_61();
LAB_0015432f:
    pgStack_128 = (gen_ctx *)0x154334;
    MIR_gen_finish_cold_59();
LAB_00154334:
    pgStack_128 = (gen_ctx *)0x154339;
    MIR_gen_finish_cold_57();
LAB_00154339:
    pgStack_128 = (gen_ctx *)0x15433e;
    MIR_gen_finish_cold_2();
LAB_0015433e:
    pgStack_128 = (gen_ctx *)0x154343;
    MIR_gen_finish_cold_4();
LAB_00154343:
    pgStack_128 = (gen_ctx *)0x154348;
    MIR_gen_finish_cold_7();
LAB_00154348:
    pgStack_128 = (gen_ctx *)0x15434d;
    MIR_gen_finish_cold_6();
LAB_0015434d:
    pgStack_128 = (gen_ctx *)0x154352;
    MIR_gen_finish_cold_8();
    goto LAB_00154352;
  }
  goto LAB_001544ce;
LAB_00152d71:
  pgStack_100 = (gen_ctx *)0x152d76;
  bb_version_generator_cold_33();
LAB_00152d76:
  pgStack_100 = (gen_ctx *)0x152d7b;
  bb_version_generator_cold_35();
LAB_00152d7b:
  pgStack_100 = (gen_ctx *)0x152d80;
  bb_version_generator_cold_34();
LAB_00152d80:
  pgStack_100 = (gen_ctx *)0x152d85;
  bb_version_generator_cold_30();
LAB_00152d85:
  pgStack_100 = (gen_ctx *)0x152d8a;
  bb_version_generator_cold_27();
LAB_00152d8a:
  pgStack_100 = (gen_ctx *)0x152d8f;
  bb_version_generator_cold_26();
LAB_00152d8f:
  pgStack_100 = (gen_ctx *)0x152d97;
  bb_version_generator_cold_20();
LAB_00152d97:
  pgStack_100 = (gen_ctx *)0x152d9c;
  bb_version_generator_cold_37();
LAB_00152d9c:
  pgStack_100 = (gen_ctx *)0x152da1;
  bb_version_generator_cold_19();
LAB_00152da1:
  pgStack_100 = (gen_ctx *)0x152da9;
  bb_version_generator_cold_22();
LAB_00152da9:
  pgStack_100 = (gen_ctx *)0x152dae;
  bb_version_generator_cold_48();
LAB_00152dae:
  pgStack_100 = (gen_ctx *)0x152db3;
  bb_version_generator_cold_47();
LAB_00152db3:
  pgStack_100 = (gen_ctx *)0x152db8;
  bb_version_generator_cold_3();
LAB_00152db8:
  pgStack_100 = (gen_ctx *)0x152dbd;
  bb_version_generator_cold_5();
LAB_00152dbd:
  pgStack_100 = (gen_ctx *)0x152dc2;
  bb_version_generator_cold_7();
LAB_00152dc2:
  pgStack_100 = (gen_ctx *)0x152dc7;
  bb_version_generator_cold_9();
LAB_00152dc7:
  pgStack_100 = (gen_ctx *)0x152dcc;
  bb_version_generator_cold_46();
LAB_00152dcc:
  pgStack_100 = (gen_ctx *)0x152dd1;
  bb_version_generator_cold_45();
LAB_00152dd1:
  pgStack_100 = (gen_ctx *)0x152dd6;
  bb_version_generator_cold_44();
LAB_00152dd6:
  pgStack_100 = (gen_ctx *)0x152ddb;
  bb_version_generator_cold_55();
LAB_00152ddb:
  pgStack_100 = (gen_ctx *)0x152de0;
  bb_version_generator_cold_54();
LAB_00152de0:
  pgStack_100 = (gen_ctx *)0x152de5;
  bb_version_generator_cold_53();
LAB_00152de5:
  pgStack_100 = (gen_ctx *)0x152dea;
  bb_version_generator_cold_52();
LAB_00152dea:
  pgStack_100 = (gen_ctx *)0x152def;
  bb_version_generator_cold_51();
LAB_00152def:
  pgStack_100 = (gen_ctx *)0x152df4;
  bb_version_generator_cold_50();
LAB_00152df4:
  pgStack_100 = (gen_ctx *)0x152df9;
  bb_version_generator_cold_49();
LAB_00152df9:
  pgStack_100 = (gen_ctx *)0x152dfe;
  bb_version_generator_cold_43();
LAB_00152dfe:
  pgStack_100 = (gen_ctx *)0x152e03;
  bb_version_generator_cold_42();
LAB_00152e03:
  pgStack_100 = (gen_ctx *)0x152e08;
  bb_version_generator_cold_29();
LAB_00152e08:
  pgStack_100 = (gen_ctx *)0x152e27;
  __assert_fail("curr_insn->ops[2].mode == MIR_OP_INT || curr_insn->ops[2].mode == MIR_OP_UINT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x264a,"void generate_bb_version_machine_code(gen_ctx_t, bb_version_t)");
LAB_0015394a:
  do {
    pgVar16 = *(gen_ctx **)((long)pMVar28[1].environment_module.data + (long)pgVar20 * 8);
    if (pgVar16 != (gen_ctx *)0x0) {
      pgVar18 = (gen_ctx *)pgVar16->curr_func_item;
      if (pgVar18 == (gen_ctx *)0x0) goto LAB_00154343;
      pgStack_128 = (gen_ctx *)0x15396c;
      free(pgVar18);
      pgStack_128 = (gen_ctx *)0x153974;
      free(pgVar16);
      pgVar18 = pgVar16;
    }
    pgVar20 = (gen_ctx *)((long)&pgVar20->ctx + 1);
  } while (pgVar20 != (gen_ctx *)0x2a);
  unaff_R13 = (gen_ctx *)pMVar28[1].environment_module.data;
  pgVar20 = (gen_ctx *)unaff_R13->gvn_ctx;
  pgVar22 = pgVar18;
  pgVar18 = pgVar20;
  if ((VARR_MIR_proto_t *)pgVar20->to_free != (VARR_MIR_proto_t *)0x0) {
    pgStack_128 = (gen_ctx *)0x15399a;
    HTAB_lr_gap_t_clear((HTAB_lr_gap_t *)pgVar20);
    pgVar18 = (gen_ctx *)unaff_R13->gvn_ctx;
    pgVar22 = pgVar20;
  }
  pgVar16 = *(gen_ctx **)&pgVar18->addr_insn_p;
  pgVar20 = pgVar16;
  if ((pgVar16 == (gen_ctx *)0x0) ||
     (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) {
LAB_0015440b:
    pgVar16 = pgVar22;
    pgStack_128 = (gen_ctx *)0x154410;
    MIR_gen_finish_cold_52();
LAB_00154410:
    pgStack_128 = (gen_ctx *)0x154415;
    MIR_gen_finish_cold_51();
LAB_00154415:
    pgVar22 = pgVar16;
    pgStack_128 = (gen_ctx *)0x15441a;
    MIR_gen_finish_cold_50();
LAB_0015441a:
    pgStack_128 = (gen_ctx *)0x15441f;
    MIR_gen_finish_cold_49();
LAB_0015441f:
    pgVar16 = pgVar22;
    pgStack_128 = (gen_ctx *)0x154424;
    MIR_gen_finish_cold_48();
LAB_00154424:
    pgStack_128 = (gen_ctx *)0x154429;
    MIR_gen_finish_cold_47();
LAB_00154429:
    pgVar22 = pgVar16;
    pgStack_128 = (gen_ctx *)0x15442e;
    MIR_gen_finish_cold_46();
LAB_0015442e:
    pgStack_128 = (gen_ctx *)0x154433;
    MIR_gen_finish_cold_45();
LAB_00154433:
    pgVar16 = pgVar22;
    pgStack_128 = (gen_ctx *)0x154438;
    MIR_gen_finish_cold_44();
  }
  else {
    pgStack_128 = (gen_ctx *)0x1539c1;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x1539c9;
    free(pgVar16);
    *(VARR_char **)&pgVar18->addr_insn_p = (VARR_char *)0x0;
    pgVar20 = (gen_ctx *)unaff_R13->gvn_ctx;
    pgVar18 = (gen_ctx *)pgVar20->tied_regs;
    if ((pgVar18 == (gen_ctx *)0x0) ||
       (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154410;
    pgStack_128 = (gen_ctx *)0x1539f8;
    free(pgVar16);
    pgStack_128 = (gen_ctx *)0x153a00;
    free(pgVar18);
    pgVar20->tied_regs = (bitmap_t)0x0;
    pgVar16 = (gen_ctx *)unaff_R13->gvn_ctx;
    pgStack_128 = (gen_ctx *)0x153a14;
    free(pgVar16);
    unaff_R13->gvn_ctx = (gvn_ctx *)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.data;
    pgVar22 = (gen_ctx *)pgVar20->coalesce_ctx;
    pgVar18 = pgVar22;
    if ((pgVar22 == (gen_ctx *)0x0) ||
       (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154415;
    pgStack_128 = (gen_ctx *)0x153a45;
    free(pgVar16);
    pgStack_128 = (gen_ctx *)0x153a4d;
    free(pgVar22);
    pgVar20->coalesce_ctx = (coalesce_ctx *)0x0;
    pgVar18 = *(gen_ctx **)((long)pMVar28[1].environment_module.data + 0x170);
    if ((pgVar18 == (gen_ctx *)0x0) ||
       (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015441a;
    pgStack_128 = (gen_ctx *)0x153a82;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x153a8a;
    free(pgVar18);
    pgVar22 = (gen_ctx *)pMVar28[1].environment_module.data;
    pgStack_128 = (gen_ctx *)0x153a96;
    free(pgVar22);
    pMVar28[1].environment_module.data = (void *)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.name;
    pgVar16 = (gen_ctx *)pgVar20->ctx;
    pgVar18 = pgVar16;
    if ((pgVar16 == (gen_ctx *)0x0) ||
       (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015441f;
    pgStack_128 = (gen_ctx *)0x153ac7;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x153acf;
    free(pgVar16);
    pgVar20->ctx = (MIR_context_t)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.name;
    pgVar18 = *(gen_ctx **)&pgVar20->optimize_level;
    if ((pgVar18 == (gen_ctx *)0x0) ||
       (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154424;
    pgStack_128 = (gen_ctx *)0x153afe;
    free(pgVar16);
    pgStack_128 = (gen_ctx *)0x153b06;
    free(pgVar18);
    *(c2mir_ctx **)&pgVar20->optimize_level = (c2mir_ctx *)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.name;
    pgVar22 = *(gen_ctx **)&pgVar20->addr_insn_p;
    pgVar16 = pgVar18;
    pgVar18 = pgVar22;
    if ((pgVar22 == (gen_ctx *)0x0) ||
       (pgVar16 = (gen_ctx *)pgVar22->curr_func_item, pgVar16 == (gen_ctx *)0x0)) goto LAB_00154429;
    pgStack_128 = (gen_ctx *)0x153b36;
    free(pgVar16);
    pgStack_128 = (gen_ctx *)0x153b3e;
    free(pgVar22);
    *(VARR_char **)&pgVar20->addr_insn_p = (VARR_char *)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.name;
    pgVar18 = (gen_ctx *)pgVar20->tied_regs;
    if ((pgVar18 == (gen_ctx *)0x0) ||
       (pgVar22 = (gen_ctx *)pgVar18->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_0015442e;
    pgStack_128 = (gen_ctx *)0x153b6e;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x153b76;
    free(pgVar18);
    pgVar20->tied_regs = (bitmap_t)0x0;
    pgVar20 = (gen_ctx *)pMVar28[1].environment_module.name;
    pgVar16 = (gen_ctx *)pgVar20->addr_regs;
    pgVar22 = pgVar18;
    pgVar18 = pgVar16;
    if ((pgVar16 == (gen_ctx *)0x0) ||
       (pgVar22 = (gen_ctx *)pgVar16->curr_func_item, pgVar22 == (gen_ctx *)0x0)) goto LAB_00154433;
    pgStack_128 = (gen_ctx *)0x153ba6;
    free(pgVar22);
    pgStack_128 = (gen_ctx *)0x153bae;
    free(pgVar16);
    pgVar20->addr_regs = (bitmap_t)0x0;
    pgVar18 = *(gen_ctx **)(pMVar28[1].environment_module.name + 0x48);
    if ((pgVar18 != (gen_ctx *)0x0) &&
       (pgVar16 = (gen_ctx *)pgVar18->curr_func_item, pgVar16 != (gen_ctx *)0x0)) {
      pgStack_128 = (gen_ctx *)0x153bdd;
      free(pgVar16);
      pgStack_128 = (gen_ctx *)0x153be5;
      free(pgVar18);
      pgVar18 = (gen_ctx *)pMVar28[1].environment_module.name;
      pgStack_128 = (gen_ctx *)0x153bf1;
      free(pgVar18);
      pgVar20 = (gen_ctx *)&DAT_0000000d;
      pMVar28[1].environment_module.name = (char *)0x0;
LAB_00153c02:
      pgVar16 = (&pMVar28->gen_ctx)[(long)pgVar20];
      if ((pgVar16 != (gen_ctx *)0x0) &&
         (pgVar18 = (gen_ctx *)pgVar16->curr_func_item, pgVar18 != (gen_ctx *)0x0))
      goto code_r0x00153c1c;
      pgStack_128 = (gen_ctx *)0x154311;
      MIR_gen_finish_cold_42();
LAB_00154311:
      pgStack_128 = (gen_ctx *)0x154316;
      MIR_gen_finish_cold_1();
LAB_00154316:
      pgStack_128 = (gen_ctx *)0x15431b;
      MIR_gen_finish_cold_3();
LAB_0015431b:
      pgStack_128 = (gen_ctx *)0x154320;
      MIR_gen_finish_cold_5();
      goto LAB_00154320;
    }
  }
  pgStack_128 = (gen_ctx *)0x15443d;
  MIR_gen_finish_cold_43();
LAB_0015443d:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x154442;
  MIR_gen_finish_cold_41();
LAB_00154442:
  pgStack_128 = (gen_ctx *)0x154447;
  MIR_gen_finish_cold_40();
LAB_00154447:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x15444c;
  MIR_gen_finish_cold_39();
LAB_0015444c:
  pgStack_128 = (gen_ctx *)0x154451;
  MIR_gen_finish_cold_38();
LAB_00154451:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x154456;
  MIR_gen_finish_cold_37();
LAB_00154456:
  pgStack_128 = (gen_ctx *)0x15445b;
  MIR_gen_finish_cold_36();
LAB_0015445b:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x154460;
  MIR_gen_finish_cold_35();
LAB_00154460:
  pgStack_128 = (gen_ctx *)0x154465;
  MIR_gen_finish_cold_34();
LAB_00154465:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x15446a;
  MIR_gen_finish_cold_33();
LAB_0015446a:
  pgStack_128 = (gen_ctx *)0x15446f;
  MIR_gen_finish_cold_32();
LAB_0015446f:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x154474;
  MIR_gen_finish_cold_31();
LAB_00154474:
  pgStack_128 = (gen_ctx *)0x154479;
  MIR_gen_finish_cold_30();
LAB_00154479:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x15447e;
  MIR_gen_finish_cold_29();
LAB_0015447e:
  pgStack_128 = (gen_ctx *)0x154483;
  MIR_gen_finish_cold_28();
LAB_00154483:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x154488;
  MIR_gen_finish_cold_27();
LAB_00154488:
  pgStack_128 = (gen_ctx *)0x15448d;
  MIR_gen_finish_cold_26();
LAB_0015448d:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x154492;
  MIR_gen_finish_cold_25();
LAB_00154492:
  pgStack_128 = (gen_ctx *)0x154497;
  MIR_gen_finish_cold_24();
LAB_00154497:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x15449c;
  MIR_gen_finish_cold_23();
LAB_0015449c:
  pgStack_128 = (gen_ctx *)0x1544a1;
  MIR_gen_finish_cold_22();
LAB_001544a1:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x1544a6;
  MIR_gen_finish_cold_21();
LAB_001544a6:
  pgStack_128 = (gen_ctx *)0x1544ab;
  MIR_gen_finish_cold_20();
LAB_001544ab:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x1544b0;
  MIR_gen_finish_cold_19();
LAB_001544b0:
  pgStack_128 = (gen_ctx *)0x1544b5;
  MIR_gen_finish_cold_18();
LAB_001544b5:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x1544ba;
  MIR_gen_finish_cold_17();
LAB_001544ba:
  pgStack_128 = (gen_ctx *)0x1544bf;
  MIR_gen_finish_cold_16();
LAB_001544bf:
  pgVar16 = pgVar22;
  pgStack_128 = (gen_ctx *)0x1544c4;
  MIR_gen_finish_cold_15();
LAB_001544c4:
  pgStack_128 = (gen_ctx *)0x1544c9;
  MIR_gen_finish_cold_14();
LAB_001544c9:
  pgVar22 = pgVar16;
  pgStack_128 = (gen_ctx *)0x1544ce;
  MIR_gen_finish_cold_13();
  pgVar16 = pgVar18;
LAB_001544ce:
  pgStack_128 = (gen_ctx *)0x1544d3;
  MIR_gen_finish_cold_12();
  pgVar41 = pgVar39;
  pgVar18 = pgVar22;
LAB_001544d3:
  pgVar39 = pgVar41;
  pgStack_128 = (gen_ctx *)0x1544d8;
  MIR_gen_finish_cold_96();
LAB_001544d8:
  pgStack_128 = (gen_ctx *)0x1544dd;
  MIR_gen_finish_cold_60();
LAB_001544dd:
  pgStack_128 = (gen_ctx *)0x1544e2;
  MIR_gen_finish_cold_58();
LAB_001544e2:
  pgStack_128 = (gen_ctx *)0x1544e7;
  MIR_gen_finish_cold_56();
LAB_001544e7:
  pgStack_128 = (gen_ctx *)MIR_set_gen_interface;
  MIR_gen_finish_cold_10();
  pgStack_150 = pgVar39;
  pgStack_148 = pgVar20;
  pgStack_140 = unaff_R13;
  pMStack_138 = pMVar28;
  pgStack_130 = pgVar16;
  pgStack_128 = pgVar44;
  if (pgVar45 != (gen_ctx *)0x0) {
    pvVar23 = generate_func_code((MIR_context_t)pgVar18,(MIR_item_t)pgVar45,1);
    return pvVar23;
  }
  pgVar20 = (gen_ctx *)pgVar18->ctx;
  pVVar24 = pgVar20->target_ctx->call_refs;
  pcVar47 = (char *)0x0;
  if (pVVar24 != (VARR_call_ref_t *)0x0) {
    sVar43 = pVVar24->els_num;
    if (sVar43 != 0) {
      ppuVar52 = &pVVar24->varr->call_addr;
      pgStack_160 = pgVar18;
      do {
        pMVar8 = (((call_ref_t *)(ppuVar52 + -1))->ref_func_item->u).func;
        pMVar49 = (MIR_item_t_conflict)pMVar8->machine_code;
        pMVar32 = (MIR_item_t_conflict)*ppuVar52;
        iStack_164 = *(int *)((long)&pMVar32->data + 2);
        lVar40 = (long)iStack_164;
        pMStack_158 = pMVar49;
        if (*(uint8_t *)&pMVar32->data == '@') {
          pMVar48 = (MIR_item_t_conflict)((long)&pMVar32->data + lVar40 + 6);
          if ((pMVar48 != pMVar49) &&
             (lVar40 = (long)pMVar49 - (long)((long)&pMVar32->data + 6),
             0xfffffffeffffffff < lVar40 - 0x80000000U)) {
            pcVar47 = (char *)((long)&pMVar32->data + 2);
            iStack_164 = (int)lVar40;
            pgVar18 = pgStack_160;
            _MIR_change_code((MIR_context_t)pgStack_160,(uint8_t *)pcVar47,(uint8_t *)&iStack_164,4)
            ;
            pcVar38 = "32";
            addr = pMVar32;
            pMVar49 = pMVar48;
            goto LAB_001545fa;
          }
          if ((pgVar20->debug_file == (FILE *)0x0) || (pgVar20->debug_level < 2)) goto LAB_0015463f;
          pcVar38 = pMVar8->name;
          pcVar47 = 
          "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
          ;
LAB_00154668:
          pgVar18 = _stderr;
          fprintf((FILE *)_stderr,pcVar47,pcVar38,pMVar32,pMVar48,pMVar49);
        }
        else {
          if (*(uint8_t *)&pMVar32->data != 0xff) {
            __assert_fail("call_addr[0] == 0x40",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
          }
          pMVar48 = *(MIR_item_t_conflict *)((long)&pMVar32->data + lVar40 + 6);
          if (pMVar49 != pMVar48) {
            addr = (MIR_item_t_conflict)((long)&pMVar32->data + lVar40 + 6);
            pcVar47 = (char *)addr;
            pgVar18 = pgStack_160;
            _MIR_change_code((MIR_context_t)pgStack_160,(uint8_t *)addr,(uint8_t *)&pMStack_158,8);
            pcVar38 = "64";
            pMVar49 = pMVar48;
LAB_001545fa:
            if ((pgVar20->debug_file != (FILE *)0x0) && (1 < pgVar20->debug_level)) {
              pMVar32 = (MIR_item_t_conflict)pMVar8->name;
              pcVar47 = 
              "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
              ;
              pMVar48 = addr;
              goto LAB_00154668;
            }
          }
        }
LAB_0015463f:
        ppuVar52 = ppuVar52 + 2;
        sVar43 = sVar43 - 1;
      } while (sVar43 != 0);
      pVVar24 = pgVar20->target_ctx->call_refs;
      if ((pVVar24 == (VARR_call_ref_t *)0x0) || (pVVar24->varr == (call_ref_t *)0x0)) {
        MIR_set_gen_interface_cold_1();
        goto LAB_001546c3;
      }
      pVVar24->els_num = 0;
    }
    return pVVar24;
  }
LAB_001546c3:
  MIR_set_gen_interface_cold_2();
  if ((MIR_item_t_conflict)pcVar47 != (MIR_item_t_conflict)0x0) {
    pvVar23 = _MIR_get_wrapper((MIR_context_t)pgVar18,(MIR_item_t_conflict)pcVar47,
                               generate_func_and_redirect_to_func_code);
    _MIR_redirect_thunk((MIR_context_t)pgVar18,((MIR_item_t_conflict)pcVar47)->addr,pvVar23);
    return extraout_RAX_03;
  }
  return extraout_RAX_02;
  while( true ) {
    pcVar5 = pVVar29->varr;
    if (pcVar5 == (const_ref_t *)0x0) goto LAB_00152d76;
    pVVar1 = ptVar19->result_code;
    if (pVVar1 == (VARR_uint8_t *)0x0) goto LAB_00152d7b;
    uVar50 = pcVar5[uVar46].const_num;
    puVar35 = pVVar1->varr + pcVar5[uVar46].pc;
    lVar40 = pVVar1->els_num - pcVar5[uVar46].next_insn_disp;
    uVar25 = 5;
    do {
      *puVar35 = (uint8_t)lVar40;
      puVar35 = puVar35 + 1;
      lVar40 = lVar40 >> 8;
      uVar25 = uVar25 - 1;
    } while (1 < uVar25);
    pVVar30 = gen_ctx->target_ctx->const_pool;
    if (((pVVar30 == (VARR_uint64_t *)0x0) || (pVVar30->varr == (uint64_t *)0x0)) ||
       (pVVar30->els_num <= uVar50)) goto LAB_00152d71;
    uVar54 = pVVar30->varr[uVar50];
    uVar25 = 9;
    do {
      pgStack_100 = (gen_ctx *)0x1528d9;
      put_byte((gen_ctx *)gen_ctx->target_ctx->result_code,(uint)uVar54 & 0xff);
      uVar54 = uVar54 >> 8;
      uVar25 = uVar25 - 1;
    } while (1 < uVar25);
    uVar25 = 9;
    do {
      pgStack_100 = (gen_ctx *)0x1528fb;
      put_byte((gen_ctx *)gen_ctx->target_ctx->result_code,0);
      uVar25 = uVar25 - 1;
    } while (1 < uVar25);
    ptVar19 = gen_ctx->target_ctx;
    uVar46 = uVar46 + 1;
    pVVar29 = ptVar19->const_refs;
    if (pVVar29 == (VARR_const_ref_t *)0x0) break;
LAB_0015283f:
    if (pVVar29->els_num <= uVar46) goto LAB_0015291e;
  }
LAB_00152919:
  pgStack_100 = (gen_ctx *)0x15291e;
  bb_version_generator_cold_36();
  ptVar19 = extraout_RAX;
LAB_0015291e:
  pVVar1 = ptVar19->result_code;
  if (pVVar1 == (VARR_uint8_t *)0x0) goto LAB_00152e31;
  local_b8 = (gen_ctx *)pVVar1->els_num;
  pgStack_100 = (gen_ctx *)0x152941;
  pgVar20 = (gen_ctx *)_MIR_publish_code((MIR_context_t)local_a8,pVVar1->varr,(size_t)local_b8);
  pVVar21 = gen_ctx->target_ctx->label_refs;
  if (pVVar21 != (VARR_label_ref_t *)0x0) {
    pMVar28 = gen_ctx->ctx;
    uVar46 = 0xffffffffffffffff;
    lVar40 = 0;
    do {
      uVar46 = uVar46 + 1;
      if (pVVar21->els_num <= uVar46) goto LAB_001529f0;
      if (pVVar21->varr == (label_ref_t *)0x0) goto LAB_00152d80;
      pcVar47 = &pVVar21->varr->abs_addr_p + lVar40;
      local_68._0_8_ = *(undefined8 *)pcVar47;
      local_68.label_val_disp = *(size_t *)(pcVar47 + 8);
      local_68.next_insn_disp = *(size_t *)(pcVar47 + 0x10);
      local_68.u = (anon_union_8_2_369d9a33_for_u)
                   ((anon_union_8_2_369d9a33_for_u *)(pcVar47 + 0x18))->jump_addr;
      if (local_68.abs_addr_p == '\0') {
        pgStack_100 = (gen_ctx *)0x1529d7;
        setup_rel32((gen_ctx_t)gen_ctx->ctx,&local_68,(uint8_t *)pgVar20,local_68.u.jump_addr);
      }
      else {
        pgStack_100 = (gen_ctx *)0x1529b7;
        _MIR_change_code(pMVar28,(uint8_t *)
                                 ((long)pgVar20->call_used_hard_regs +
                                 (long)&((bitmap_t)(local_68.label_val_disp + -0x78))->varr),
                         (uint8_t *)&local_68.u,8);
      }
      lVar40 = lVar40 + 0x20;
      pVVar21 = gen_ctx->target_ctx->label_refs;
    } while (pVVar21 != (VARR_label_ref_t *)0x0);
  }
  pgStack_100 = (gen_ctx *)0x1529f0;
  bb_version_generator_cold_31();
LAB_001529f0:
  pgStack_100 = (gen_ctx *)0x1529fb;
  change_calls(gen_ctx,(uint8_t *)pgVar20);
  ptVar19 = gen_ctx->target_ctx;
  pVVar6 = ptVar19->relocs;
  if ((pVVar6 == (VARR_MIR_code_reloc_t *)0x0) || (pVVar6->varr == (MIR_code_reloc_t *)0x0))
  goto LAB_00152e03;
  pVVar6->els_num = 0;
  pVVar30 = ptVar19->abs_address_locs;
  if (pVVar30 != (VARR_uint64_t *)0x0) {
    uVar46 = 0;
    local_c0 = pgVar20;
    do {
      if (pVVar30->els_num <= uVar46) goto LAB_00152aed;
      if (pVVar30->varr == (uint64_t *)0x0) goto LAB_00152d85;
      sVar43 = pVVar30->varr[uVar46];
      lVar40 = 8;
      uVar50 = 0;
      do {
        uVar50 = (ulong)*(byte *)((long)pgVar20->call_used_hard_regs + lVar40 + sVar43 + -0x69) |
                 uVar50 << 8;
        lVar40 = lVar40 + -1;
      } while (lVar40 != 0);
      pVVar6 = ptVar19->relocs;
      __ptr_01 = pVVar6->varr;
      if (__ptr_01 == (MIR_code_reloc_t *)0x0) goto LAB_00152d8a;
      sVar51 = pVVar6->els_num;
      uVar36 = sVar51 + 1;
      if (pVVar6->size < uVar36) {
        sVar51 = (uVar36 >> 1) + uVar36;
        pgStack_100 = (gen_ctx *)0x152aa8;
        __ptr_01 = (MIR_code_reloc_t *)realloc(__ptr_01,sVar51 * 0x10);
        pVVar6->varr = __ptr_01;
        pVVar6->size = sVar51;
        sVar51 = pVVar6->els_num;
        uVar36 = sVar51 + 1;
        pgVar20 = local_c0;
      }
      pVVar6->els_num = uVar36;
      uVar46 = uVar46 + 1;
      __ptr_01[sVar51].offset = sVar43;
      __ptr_01[sVar51].value = (void *)((long)pgVar20->call_used_hard_regs + (uVar50 - 0x68));
      ptVar19 = gen_ctx->target_ctx;
      pVVar30 = ptVar19->abs_address_locs;
    } while (pVVar30 != (VARR_uint64_t *)0x0);
  }
  pgStack_100 = (gen_ctx *)0x152aed;
  bb_version_generator_cold_28();
  ptVar19 = extraout_RAX_00;
LAB_00152aed:
  pVVar6 = ptVar19->relocs;
  if (pVVar6 == (VARR_MIR_code_reloc_t *)0x0) goto LAB_00152e36;
  pgStack_100 = (gen_ctx *)0x152b0c;
  _MIR_update_code_arr(gen_ctx->ctx,(uint8_t *)pgVar20,pVVar6->els_num,pVVar6->varr);
  pVVar21 = gen_ctx->target_ctx->label_refs;
  if (pVVar21 == (VARR_label_ref_t *)0x0) goto LAB_00152e3b;
  pVVar37 = gen_ctx->target_succ_bb_versions;
  if (pVVar37 != (VARR_target_bb_version_t *)0x0) {
    if (pVVar21->els_num == pVVar37->els_num) {
      lVar40 = 0;
      uVar46 = 0;
      do {
        if (pVVar37->els_num <= uVar46) goto LAB_00152bac;
        if (pVVar37->varr == (target_bb_version_t *)0x0) goto LAB_00152da1;
        ptVar7 = pVVar37->varr[uVar46];
        if (ptVar7 != (target_bb_version_t)0x0) {
          pVVar21 = gen_ctx->target_ctx->label_refs;
          if (((pVVar21 == (VARR_label_ref_t *)0x0) || (pVVar21->varr == (label_ref_t *)0x0)) ||
             (pVVar21->els_num <= uVar46)) goto LAB_00152d8f;
          pcVar47 = &pVVar21->varr->abs_addr_p + lVar40;
          sVar43 = *(size_t *)(pcVar47 + 8);
          sVar51 = *(size_t *)(pcVar47 + 0x10);
          aVar10 = *(anon_union_8_2_369d9a33_for_u *)(pcVar47 + 0x18);
          *(undefined8 *)&ptVar7->branch_ref = *(undefined8 *)pcVar47;
          (ptVar7->branch_ref).label_val_disp = sVar43;
          (ptVar7->branch_ref).next_insn_disp = sVar51;
          (ptVar7->branch_ref).u = aVar10;
          ptVar7->base = (uint8_t *)pgVar20;
          pVVar37 = gen_ctx->target_succ_bb_versions;
        }
        uVar46 = uVar46 + 1;
        lVar40 = lVar40 + 0x20;
      } while (pVVar37 != (VARR_target_bb_version_t *)0x0);
      pgStack_100 = (gen_ctx *)0x152bac;
      bb_version_generator_cold_21();
    }
LAB_00152bac:
    pgVar39 = local_b8;
    if ((gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
      pgStack_100 = (gen_ctx *)0x152bcf;
      _MIR_dump_code((char *)0x0,(uint8_t *)pgVar20,(size_t)local_b8);
      pgStack_100 = (gen_ctx *)0x152be9;
      fprintf((FILE *)gen_ctx->debug_file,"BBStub%llx code size = %lu:\n",local_a0._8_8_,pgVar39);
    }
    pbVar11 = local_70;
    puVar35 = (local_70->target_data).base;
    local_68._0_8_ = pgVar20;
    if (puVar35 != (uint8_t *)0x0) {
      if ((local_70->target_data).branch_ref.abs_addr_p == '\0') {
        pgStack_100 = (gen_ctx *)0x152c3b;
        setup_rel32((gen_ctx_t)gen_ctx->ctx,&(local_70->target_data).branch_ref,puVar35,pgVar20);
      }
      else {
        pgStack_100 = (gen_ctx *)0x152c27;
        _MIR_change_code(gen_ctx->ctx,puVar35 + (local_70->target_data).branch_ref.label_val_disp,
                         (uint8_t *)&local_68,8);
      }
      (pbVar11->target_data).base = (uint8_t *)0x0;
    }
    pgStack_100 = (gen_ctx *)0x152c57;
    _MIR_replace_bb_thunk((MIR_context_t)local_a8,pbVar11->addr,pgVar20);
    pbVar11->addr = pgVar20;
    gen_ctx->overall_gen_bbs_num = gen_ctx->overall_gen_bbs_num + 1;
    pbVar11->machine_code = pgVar20;
    return pgVar20;
  }
LAB_00152e40:
  pgStack_100 = (gen_ctx *)0x152e45;
  bb_version_generator_cold_23();
LAB_00152e45:
  pgStack_100 = (gen_ctx *)0x152e4a;
  bb_version_generator_cold_15();
LAB_00152e4a:
  pgStack_100 = (gen_ctx *)0x152e4f;
  bb_version_generator_cold_14();
LAB_00152e4f:
  pgStack_100 = (gen_ctx *)0x152e54;
  bb_version_generator_cold_13();
LAB_00152e54:
  pgStack_100 = (gen_ctx *)0x152e73;
  __assert_fail("curr_insn->ops[1].mode == MIR_OP_INT || curr_insn->ops[1].mode == MIR_OP_UINT",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x263a,"void generate_bb_version_machine_code(gen_ctx_t, bb_version_t)");
}

Assistant:

static void generate_bb_version_machine_code (gen_ctx_t gen_ctx, bb_version_t bb_version) {
  MIR_context_t ctx = gen_ctx->ctx;
  int skip_p;
  bb_stub_t branch_bb_stub, bb_stub = bb_version->bb_stub;
  MIR_insn_t curr_insn, new_insn, next_insn;
  void *addr;
  uint8_t *code;
  size_t code_len, nel;
  uint32_t prop, spot, dest_spot, src_spot, max_spot = 0;
  bitmap_t nonzero_property_spots = temp_bitmap;
  bitmap_iterator_t bi;
  spot_attr_t spot_attr;

  bitmap_clear (nonzero_property_spots);
  DEBUG (2, {
    fprintf (debug_file, "  IN BBStub%llx nonzero properties: ", (long long unsigned) bb_stub);
  });
  for (size_t i = 0; i < bb_version->n_attrs; i++) {
    bitmap_set_bit_p (nonzero_property_spots, bb_version->attrs[i].spot);
    set_spot2attr (gen_ctx, &bb_version->attrs[i]);
    DEBUG (2, {
      if (i != 0) fprintf (debug_file, ", ");
      fprintf (debug_file, "(spot=%u,prop=%u)", (unsigned) bb_version->attrs[i].spot,
               (unsigned) bb_version->attrs[i].prop);
    });
  }
  DEBUG (2, { fprintf (debug_file, "\n"); });
  if (bb_version->n_attrs != 0) max_spot = bb_version->attrs[bb_version->n_attrs - 1].spot;
  VARR_TRUNC (target_bb_version_t, target_succ_bb_versions, 0);
  target_bb_translate_start (gen_ctx);
  for (curr_insn = bb_stub->first_insn;; curr_insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, curr_insn);
    if (MIR_any_branch_code_p (curr_insn->code)) break;
    skip_p = FALSE;
    switch (curr_insn->code) {
    case MIR_USE: skip_p = TRUE; break;
    case MIR_PRSET:
      gen_assert (curr_insn->ops[1].mode == MIR_OP_INT || curr_insn->ops[1].mode == MIR_OP_UINT);
      dest_spot = op2spot (&curr_insn->ops[0]);
      if (dest_spot == 0) {
      } else if (curr_insn->ops[1].u.i == 0) { /* ??? aliased */
        bitmap_clear_bit_p (nonzero_property_spots, dest_spot);
      } else {
        bitmap_set_bit_p (nonzero_property_spots, dest_spot);
        spot_attr.spot = dest_spot;
        spot_attr.prop = (uint32_t) curr_insn->ops[1].u.i;
        spot_attr.mem_ref = mem_spot_p (dest_spot) ? &curr_insn->ops[0] : NULL;
        set_spot2attr (gen_ctx, &spot_attr);
      }
      skip_p = TRUE;
      break;
    case MIR_PRBEQ:
    case MIR_PRBNE:
      gen_assert (curr_insn->ops[2].mode == MIR_OP_INT || curr_insn->ops[2].mode == MIR_OP_UINT);
      spot = op2spot (&curr_insn->ops[1]);
      prop = 0;
      if (bitmap_bit_p (nonzero_property_spots, spot)) {
        spot_attr = VARR_GET (spot_attr_t, spot2attr, spot);
        prop = spot_attr.prop;
      }
      if ((curr_insn->code == MIR_PRBEQ && curr_insn->ops[2].u.i != prop)
          || (curr_insn->code == MIR_PRBNE && curr_insn->ops[2].u.i == prop)) {
        DEBUG (2, {
          fprintf (debug_file, "  Remove property insn ");
          MIR_output_insn (ctx, debug_file, curr_insn, curr_func_item->u.func, TRUE);
        });
        MIR_remove_insn (ctx, curr_func_item, curr_insn);
        skip_p = TRUE;
        break;
      } else { /* make unconditional jump */
        new_insn = MIR_new_insn (ctx, MIR_JMP, curr_insn->ops[0]);
        MIR_insert_insn_before (ctx, curr_func_item, curr_insn, new_insn);
        DEBUG (2, {
          fprintf (debug_file, "  Change ");
          MIR_output_insn (ctx, debug_file, curr_insn, curr_func_item->u.func, FALSE);
          fprintf (debug_file, " to ");
          MIR_output_insn (ctx, debug_file, new_insn, curr_func_item->u.func, TRUE);
        });
        MIR_remove_insn (ctx, curr_func_item, curr_insn);
        next_insn = new_insn;
        continue;
      }
    case MIR_MOV:
    case MIR_FMOV:
    case MIR_DMOV:
    case MIR_LDMOV:
      dest_spot = op2spot (&curr_insn->ops[0]);
      src_spot = op2spot (&curr_insn->ops[1]);
      if (src_spot == 0) {
        bitmap_clear_bit_p (nonzero_property_spots, dest_spot);
      } else if (dest_spot == 0) { /* clear attrs of all memory locations */
        if (max_spot >= FIRST_MEM_SPOT)
          bitmap_clear_bit_range_p (nonzero_property_spots, FIRST_MEM_SPOT,
                                    max_spot - FIRST_MEM_SPOT + 1);
      } else if (bitmap_bit_p (nonzero_property_spots, src_spot)) {
        spot_attr = VARR_GET (spot_attr_t, spot2attr, src_spot);
        spot_attr.mem_ref = NULL;
        if (mem_spot_p (dest_spot)) {
          spot_attr_t *spot_attr_addr = VARR_ADDR (spot_attr_t, spot_attrs);
          for (spot = FIRST_MEM_SPOT; spot <= max_spot; spot++)
            if (may_mem_alias_p (spot_attr_addr[dest_spot].mem_ref, spot_attr_addr[spot].mem_ref))
              bitmap_clear_bit_p (nonzero_property_spots, spot);
          spot_attr.mem_ref = &curr_insn->ops[0];
        }
        bitmap_set_bit_p (nonzero_property_spots, dest_spot);
        spot_attr.spot = dest_spot;
        set_spot2attr (gen_ctx, &spot_attr);
      }
      break;
    default: break;
    }
    if (!skip_p) {
      if (curr_insn->code != MIR_LADDR) {
        target_bb_insn_translate (gen_ctx, curr_insn, NULL);
      } else {
        VARR_TRUNC (spot_attr_t, spot_attrs, 0);
        FOREACH_BITMAP_BIT (bi, nonzero_property_spots, nel) {
          VARR_PUSH (spot_attr_t, spot_attrs, VARR_GET (spot_attr_t, spot2attr, nel));
        }
        VARR_TRUNC (void_ptr_t, succ_bb_addrs, 0);
        branch_bb_stub = curr_insn->ops[1].u.label->data;
        (void) get_bb_version (gen_ctx, branch_bb_stub,
                               (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                               VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
        VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
        target_bb_insn_translate (gen_ctx, curr_insn, VARR_ADDR (void_ptr_t, succ_bb_addrs));
      }
    }
    if (curr_insn == bb_stub->last_insn) break;
  }
  VARR_TRUNC (spot_attr_t, spot_attrs, 0);
  DEBUG (2, {
    fprintf (debug_file, "  OUT BBStub%llx nonzero properties: ", (long long unsigned) bb_stub);
  });
  FOREACH_BITMAP_BIT (bi, nonzero_property_spots, nel) {
    if (MIR_call_code_p (curr_insn->code) && mem_spot_p ((uint32_t) nel)) break;
    spot_attr = VARR_GET (spot_attr_t, spot2attr, nel);
    DEBUG (2, {
      if (VARR_LENGTH (spot_attr_t, spot_attrs) != 0) fprintf (debug_file, ", ");
      fprintf (debug_file, "(spot=%u,prop=%u)", (unsigned) spot_attr.spot,
               (unsigned) spot_attr.prop);
    });
    VARR_PUSH (spot_attr_t, spot_attrs, spot_attr);
  }
  DEBUG (2, { fprintf (debug_file, "\n"); });
  VARR_TRUNC (void_ptr_t, succ_bb_addrs, 0);
  if (curr_insn->code == MIR_JMPI) {
    target_bb_insn_translate (gen_ctx, curr_insn, NULL);
  } else if (curr_insn->code == MIR_SWITCH) {
    for (size_t i = 1; i < curr_insn->nops; i++) {
      branch_bb_stub = curr_insn->ops[i].u.label->data;
      (void) get_bb_version (gen_ctx, branch_bb_stub,
                             (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                             VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
      VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
    }
    target_bb_insn_translate (gen_ctx, curr_insn, VARR_ADDR (void_ptr_t, succ_bb_addrs));
  } else if (MIR_branch_code_p (curr_insn->code)) {  // ??? generate branch
    branch_bb_stub = curr_insn->ops[0].u.label->data;
    (void) get_bb_version (gen_ctx, branch_bb_stub,
                           (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                           VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
    VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
    target_bb_insn_translate (gen_ctx, curr_insn, VARR_ADDR (void_ptr_t, succ_bb_addrs));
  }
  if (curr_insn->code != MIR_JMP && curr_insn->code != MIR_JMPI && curr_insn->code != MIR_SWITCH
      && curr_insn->code != MIR_RET && curr_insn->code != MIR_JRET) {
    VARR_TRUNC (void_ptr_t, succ_bb_addrs, 0);
    (void) get_bb_version (gen_ctx, bb_stub + 1, (uint32_t) VARR_LENGTH (spot_attr_t, spot_attrs),
                           VARR_ADDR (spot_attr_t, spot_attrs), FALSE, &addr);
    VARR_PUSH (void_ptr_t, succ_bb_addrs, addr);
    target_output_jump (gen_ctx, VARR_ADDR (void_ptr_t, succ_bb_addrs));
  }
  code = target_bb_translate_finish (gen_ctx, &code_len);
  addr = _MIR_publish_code (ctx, code, code_len);
  target_bb_rebase (gen_ctx, addr);
  target_setup_succ_bb_version_data (gen_ctx, addr);
  DEBUG (1, {
    _MIR_dump_code (NULL, addr, code_len);
    fprintf (debug_file, "BBStub%llx code size = %lu:\n", (unsigned long long) bb_stub,
             (unsigned long) code_len);
  });
  target_redirect_bb_origin_branch (gen_ctx, &bb_version->target_data, addr);
  _MIR_replace_bb_thunk (ctx, bb_version->addr, addr);
  bb_version->addr = addr;
  overall_gen_bbs_num++;
  bb_version->machine_code = addr;
}